

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpuck.cc
# Opt level: O1

int test_exts(void)

{
  char cVar1;
  uint3 uVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  long lVar6;
  uint32_t i;
  ulong uVar7;
  long lVar8;
  char *pcVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  char *d3;
  char *d4;
  undefined8 local_50;
  char *local_48;
  char *local_40;
  char *local_38;
  
  _plan(0xec,true);
  _space((FILE *)_stdout);
  printf("# *** %s ***\n","test_exts");
  _space((FILE *)_stdout);
  fwrite("# ",2,1,_stdout);
  fwrite("ext len=0x01",0xc,1,_stdout);
  fputc(10,_stdout);
  str[0] = 'a';
  buf[1] = 0xd4;
  buf[2] = '\0';
  buf[3] = 'a';
  switch(0x12205f) {
  case 0:
    uVar4 = 0;
    pcVar9 = buf + 3;
    break;
  case 1:
    uVar4 = 0x61;
    pcVar9 = buf + 4;
    break;
  case 2:
    uVar4 = (uint)(byte)buf[5] | (CONCAT12(buf[4],0x6100) & 0xff0000) >> 8 |
            (CONCAT12(buf[4],0x6100) & 0xff00) << 8;
    pcVar9 = buf + 6;
    break;
  default:
    goto switchD_0012205d_caseD_ca;
  case 0xd:
  case 0xe:
  case 0xf:
  case 0x10:
  case 0x11:
    uVar4 = 1;
    pcVar9 = buf + 2;
  }
  cVar1 = *pcVar9;
  _ok((uint)(uVar4 == 1),"0x01 == len2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x252,
      "len(mp_decode_ext(x, %u))",1);
  _ok((uint)(cVar1 == '\0'),"ext_type == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x252,
      "type(mp_decode_ext(x))");
  if ((byte)buf[1] - 199 < 0x12) {
    local_38 = (char *)CONCAT71(local_38._1_7_,0xd4);
    local_40 = pcVar9;
    switch((uint)(byte)buf[1]) {
    case 199:
      uVar4 = (uint)(byte)buf[2];
      pcVar9 = buf + 3;
      break;
    case 200:
      uVar4 = (uint)(ushort)(CONCAT11(buf[3],buf[2]) << 8 | (ushort)(byte)buf[3]);
      pcVar9 = buf + 4;
      break;
    case 0xc9:
      uVar2 = CONCAT12(buf[4],CONCAT11(buf[3],buf[2]));
      uVar4 = (uint)(byte)buf[5] | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 |
              CONCAT13(buf[5],uVar2) << 0x18;
      pcVar9 = buf + 6;
      break;
    default:
      goto switchD_0012205d_caseD_ca;
    case 0xd4:
    case 0xd5:
    case 0xd6:
    case 0xd7:
    case 0xd8:
      uVar4 = 1 << (buf[1] + 0x2cU & 0x1f);
      pcVar9 = buf + 2;
    }
    _ok((uint)(uVar4 == 1),"0x01 == len2",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x252,"len(mp_decode_strbin(x, %u))",1);
    local_50 = (byte *)(buf + 1);
    lVar8 = 1;
    do {
      lVar6 = (long)""[*local_50];
      if (lVar6 < 0) {
        if (*local_50 == 0xd9) {
          local_50 = local_50 + (ulong)local_50[1] + 2;
          goto LAB_00122184;
        }
        if (-0x20 < ""[*local_50]) {
          lVar8 = lVar8 - lVar6;
          local_50 = local_50 + 1;
          goto LAB_00122184;
        }
        mp_next_slowpath((char **)&local_50,lVar8);
        bVar3 = false;
        lVar6 = lVar8;
      }
      else {
        local_50 = local_50 + 1 + lVar6;
LAB_00122184:
        bVar3 = true;
        lVar6 = lVar8;
      }
    } while ((bVar3) && (lVar8 = lVar6 + -1, 1 < lVar6));
    local_48 = buf + 1;
    iVar5 = mp_check(&local_48,(char *)(local_50 + 1));
    lVar8 = 0;
    _ok((uint)(iVar5 == 0),"!mp_check(&d4, d3 + 0x01)",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x252,"mp_check_ext(mp_encode_ext(x, 0x01))");
    _ok((uint)(pcVar9 + uVar4 == buf + 3),"d1 == d2",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x252,"len(mp_decode_ext(x, 0x01)");
    _ok((uint)(local_50 == (byte *)(buf + 4)),"d1 == d3",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x252,"len(mp_next_ext(x, 0x01)");
    _ok((uint)(local_48 == buf + 4),"d1 == d4",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x252,"len(mp_check_ext(x, 0x01)");
    _ok((uint)((char)local_38 != '\0'),"mp_sizeof_ext(0x01) == (uint32_t) (d1 - data)",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x252,"mp_sizeof_ext(0x01)");
    _ok((uint)(str[0] == local_40[1]),"memcmp(s1, s2, 0x01) == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x252,"mp_encode_ext(x, 0x01) == x");
    _space((FILE *)_stdout);
    fwrite("# ",2,1,_stdout);
    fwrite("ext len=0x02",0xc,1,_stdout);
    fputc(10,_stdout);
    do {
      str[lVar8] = (char)lVar8 + 'a';
      lVar8 = lVar8 + 1;
    } while (lVar8 == 1);
    buf[1] = 0xd5;
    buf[2] = '\0';
    switch(0x1223d1) {
    case 0:
      uVar4 = 0;
      local_38 = buf + 3;
      break;
    case 1:
      uVar4 = (uint)(byte)buf[3];
      local_38 = buf + 4;
      break;
    case 2:
      uVar4 = (uint)(byte)buf[5] | CONCAT11(buf[4],buf[3]) & 0xff00 |
              (CONCAT11(buf[4],buf[3]) & 0xff) << 0x10;
      local_38 = buf + 6;
      break;
    default:
      goto switchD_0012205d_caseD_ca;
    case 0xd:
    case 0xe:
    case 0xf:
    case 0x10:
    case 0x11:
      uVar4 = 2;
      local_38 = buf + 2;
    }
    cVar1 = *local_38;
    _ok((uint)(uVar4 == 2),"0x02 == len2",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x253,"len(mp_decode_ext(x, %u))",2);
    _ok((uint)(cVar1 == '\0'),"ext_type == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x253,"type(mp_decode_ext(x))");
    if ((byte)buf[1] - 199 < 0x12) {
      local_40 = (char *)CONCAT71(local_40._1_7_,0xd5);
      switch((uint)(byte)buf[1]) {
      case 199:
        uVar4 = (uint)(byte)buf[2];
        pcVar9 = buf + 3;
        break;
      case 200:
        uVar4 = (uint)(ushort)(CONCAT11(buf[3],buf[2]) << 8 | (ushort)(byte)buf[3]);
        pcVar9 = buf + 4;
        break;
      case 0xc9:
        uVar2 = CONCAT12(buf[4],CONCAT11(buf[3],buf[2]));
        uVar4 = (uint)(byte)buf[5] | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 |
                CONCAT13(buf[5],uVar2) << 0x18;
        pcVar9 = buf + 6;
        break;
      default:
        goto switchD_0012205d_caseD_ca;
      case 0xd4:
      case 0xd5:
      case 0xd6:
      case 0xd7:
      case 0xd8:
        uVar4 = 1 << (buf[1] + 0x2cU & 0x1f);
        pcVar9 = buf + 2;
      }
      _ok((uint)(uVar4 == 2),"0x02 == len2",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
          0x253,"len(mp_decode_strbin(x, %u))",2);
      local_50 = (byte *)(buf + 1);
      lVar8 = 1;
      do {
        lVar6 = (long)""[*local_50];
        if (lVar6 < 0) {
          if (*local_50 == 0xd9) {
            local_50 = local_50 + (ulong)local_50[1] + 2;
            goto LAB_001224ed;
          }
          if (-0x20 < ""[*local_50]) {
            lVar8 = lVar8 - lVar6;
            local_50 = local_50 + 1;
            goto LAB_001224ed;
          }
          mp_next_slowpath((char **)&local_50,lVar8);
          bVar3 = false;
          lVar6 = lVar8;
        }
        else {
          local_50 = local_50 + 1 + lVar6;
LAB_001224ed:
          bVar3 = true;
          lVar6 = lVar8;
        }
      } while ((bVar3) && (lVar8 = lVar6 + -1, 1 < lVar6));
      local_48 = buf + 1;
      iVar5 = mp_check(&local_48,(char *)(local_50 + 2));
      lVar8 = 0;
      _ok((uint)(iVar5 == 0),"!mp_check(&d4, d3 + 0x02)",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
          0x253,"mp_check_ext(mp_encode_ext(x, 0x02))");
      _ok((uint)(pcVar9 + uVar4 == buf + 4),"d1 == d2",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
          0x253,"len(mp_decode_ext(x, 0x02)");
      _ok((uint)(local_50 == (byte *)(buf + 5)),"d1 == d3",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
          0x253,"len(mp_next_ext(x, 0x02)");
      _ok((uint)(local_48 == buf + 5),"d1 == d4",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
          0x253,"len(mp_check_ext(x, 0x02)");
      _ok((uint)((char)local_40 != '\0'),"mp_sizeof_ext(0x02) == (uint32_t) (d1 - data)",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
          0x253,"mp_sizeof_ext(0x02)");
      _ok((uint)(CONCAT11(str[1],str[0]) == *(short *)(local_38 + 1)),"memcmp(s1, s2, 0x02) == 0",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
          0x253,"mp_encode_ext(x, 0x02) == x");
      _space((FILE *)_stdout);
      fwrite("# ",2,1,_stdout);
      fwrite("ext len=0x03",0xc,1,_stdout);
      fputc(10,_stdout);
      do {
        str[lVar8] = (char)lVar8 + 'a';
        lVar8 = lVar8 + 1;
      } while (lVar8 != 3);
      buf[1] = -0x39;
      buf[2] = '\x03';
      buf[3] = '\0';
      buf[6] = str[2];
      switch(0x12779f) {
      case 0:
        uVar4 = 3;
        local_38 = buf + 3;
        break;
      case 1:
        uVar4 = 0x300;
        local_38 = buf + 4;
        break;
      case 2:
        uVar4 = (uint)(byte)buf[5] | (uint)(uint3)(CONCAT12(buf[4],3) >> 8) |
                CONCAT13(buf[5],CONCAT12(buf[4],3)) << 0x18;
        local_38 = buf + 6;
        break;
      default:
        goto switchD_0012205d_caseD_ca;
      case 0xd:
      case 0xe:
      case 0xf:
      case 0x10:
      case 0x11:
        uVar4 = 0x80000;
        local_38 = buf + 2;
      }
      cVar1 = *local_38;
      _ok((uint)(uVar4 == 3),"0x03 == len2",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
          0x254,"len(mp_decode_ext(x, %u))",3);
      _ok((uint)(cVar1 == '\0'),"ext_type == 0",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
          0x254,"type(mp_decode_ext(x))");
      if ((byte)buf[1] - 199 < 0x12) {
        local_40 = (char *)((ulong)local_40 & 0xffffffffffffff00);
        switch((uint)(byte)buf[1]) {
        case 199:
          uVar4 = (uint)(byte)buf[2];
          pcVar9 = buf + 3;
          break;
        case 200:
          uVar4 = (uint)(ushort)(CONCAT11(buf[3],buf[2]) << 8 | (ushort)(byte)buf[3]);
          pcVar9 = buf + 4;
          break;
        case 0xc9:
          uVar2 = CONCAT12(buf[4],CONCAT11(buf[3],buf[2]));
          uVar4 = (uint)(byte)buf[5] | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 |
                  CONCAT13(buf[5],uVar2) << 0x18;
          pcVar9 = buf + 6;
          break;
        default:
          goto switchD_0012205d_caseD_ca;
        case 0xd4:
        case 0xd5:
        case 0xd6:
        case 0xd7:
        case 0xd8:
          uVar4 = 1 << (buf[1] + 0x2cU & 0x1f);
          pcVar9 = buf + 2;
        }
        _ok((uint)(uVar4 == 3),"0x03 == len2",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
            0x254,"len(mp_decode_strbin(x, %u))",3);
        local_50 = (byte *)(buf + 1);
        lVar8 = 1;
        do {
          lVar6 = (long)""[*local_50];
          if (lVar6 < 0) {
            if (*local_50 == 0xd9) {
              local_50 = local_50 + (ulong)local_50[1] + 2;
              goto LAB_00122862;
            }
            if (-0x20 < ""[*local_50]) {
              lVar8 = lVar8 - lVar6;
              local_50 = local_50 + 1;
              goto LAB_00122862;
            }
            mp_next_slowpath((char **)&local_50,lVar8);
            bVar3 = false;
            lVar6 = lVar8;
          }
          else {
            local_50 = local_50 + 1 + lVar6;
LAB_00122862:
            bVar3 = true;
            lVar6 = lVar8;
          }
        } while ((bVar3) && (lVar8 = lVar6 + -1, 1 < lVar6));
        local_48 = buf + 1;
        iVar5 = mp_check(&local_48,(char *)(local_50 + 3));
        lVar8 = 0;
        _ok((uint)(iVar5 == 0),"!mp_check(&d4, d3 + 0x03)",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
            0x254,"mp_check_ext(mp_encode_ext(x, 0x03))");
        _ok((uint)(pcVar9 + uVar4 == buf + 6),"d1 == d2",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
            0x254,"len(mp_decode_ext(x, 0x03)");
        _ok((uint)(local_50 == (byte *)(buf + 7)),"d1 == d3",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
            0x254,"len(mp_next_ext(x, 0x03)");
        _ok((uint)(local_48 == buf + 7),"d1 == d4",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
            0x254,"len(mp_check_ext(x, 0x03)");
        _ok((uint)((char)local_40 == '\0'),"mp_sizeof_ext(0x03) == (uint32_t) (d1 - data)",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
            0x254,"mp_sizeof_ext(0x03)");
        _ok((uint)(str[2] == local_38[3] && CONCAT11(str[1],str[0]) == *(short *)(local_38 + 1)),
            "memcmp(s1, s2, 0x03) == 0",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
            0x254,"mp_encode_ext(x, 0x03) == x");
        _space((FILE *)_stdout);
        fwrite("# ",2,1,_stdout);
        fwrite("ext len=0x04",0xc,1,_stdout);
        fputc(10,_stdout);
        do {
          str[lVar8] = (char)lVar8 + 'a';
          lVar8 = lVar8 + 1;
        } while (lVar8 != 4);
        buf[1] = 0xd6;
        buf[2] = '\0';
        switch(0x122abd) {
        case 0:
          uVar4 = 0;
          local_38 = buf + 3;
          break;
        case 1:
          uVar4 = (uint)(byte)buf[3];
          local_38 = buf + 4;
          break;
        case 2:
          uVar4 = (uint)(byte)buf[5] | CONCAT11(buf[4],buf[3]) & 0xff00 |
                  (CONCAT11(buf[4],buf[3]) & 0xff) << 0x10;
          local_38 = buf + 6;
          break;
        default:
          goto switchD_0012205d_caseD_ca;
        case 0xd:
        case 0xe:
        case 0xf:
        case 0x10:
        case 0x11:
          uVar4 = 4;
          local_38 = buf + 2;
        }
        cVar1 = *local_38;
        _ok((uint)(uVar4 == 4),"0x04 == len2",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
            0x255,"len(mp_decode_ext(x, %u))",4);
        _ok((uint)(cVar1 == '\0'),"ext_type == 0",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
            0x255,"type(mp_decode_ext(x))");
        if ((byte)buf[1] - 199 < 0x12) {
          local_40 = (char *)CONCAT71(local_40._1_7_,0xd6);
          switch((uint)(byte)buf[1]) {
          case 199:
            uVar4 = (uint)(byte)buf[2];
            pcVar9 = buf + 3;
            break;
          case 200:
            uVar4 = (uint)(ushort)(CONCAT11(buf[3],buf[2]) << 8 | (ushort)(byte)buf[3]);
            pcVar9 = buf + 4;
            break;
          case 0xc9:
            uVar2 = CONCAT12(buf[4],CONCAT11(buf[3],buf[2]));
            uVar4 = (uint)(byte)buf[5] | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 |
                    CONCAT13(buf[5],uVar2) << 0x18;
            pcVar9 = buf + 6;
            break;
          default:
            goto switchD_0012205d_caseD_ca;
          case 0xd4:
          case 0xd5:
          case 0xd6:
          case 0xd7:
          case 0xd8:
            uVar4 = 1 << (buf[1] + 0x2cU & 0x1f);
            pcVar9 = buf + 2;
          }
          _ok((uint)(uVar4 == 4),"0x04 == len2",
              "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
              ,0x255,"len(mp_decode_strbin(x, %u))",4);
          local_50 = (byte *)(buf + 1);
          lVar8 = 1;
          do {
            lVar6 = (long)""[*local_50];
            if (lVar6 < 0) {
              if (*local_50 == 0xd9) {
                local_50 = local_50 + (ulong)local_50[1] + 2;
                goto LAB_00122bd9;
              }
              if (-0x20 < ""[*local_50]) {
                lVar8 = lVar8 - lVar6;
                local_50 = local_50 + 1;
                goto LAB_00122bd9;
              }
              mp_next_slowpath((char **)&local_50,lVar8);
              bVar3 = false;
              lVar6 = lVar8;
            }
            else {
              local_50 = local_50 + 1 + lVar6;
LAB_00122bd9:
              bVar3 = true;
              lVar6 = lVar8;
            }
          } while ((bVar3) && (lVar8 = lVar6 + -1, 1 < lVar6));
          local_48 = buf + 1;
          iVar5 = mp_check(&local_48,(char *)(local_50 + 4));
          lVar8 = 0;
          _ok((uint)(iVar5 == 0),"!mp_check(&d4, d3 + 0x04)",
              "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
              ,0x255,"mp_check_ext(mp_encode_ext(x, 0x04))");
          _ok((uint)(pcVar9 + uVar4 == buf + 6),"d1 == d2",
              "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
              ,0x255,"len(mp_decode_ext(x, 0x04)");
          _ok((uint)(local_50 == (byte *)(buf + 7)),"d1 == d3",
              "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
              ,0x255,"len(mp_next_ext(x, 0x04)");
          _ok((uint)(local_48 == buf + 7),"d1 == d4",
              "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
              ,0x255,"len(mp_check_ext(x, 0x04)");
          _ok((uint)((char)local_40 != '\0'),"mp_sizeof_ext(0x04) == (uint32_t) (d1 - data)",
              "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
              ,0x255,"mp_sizeof_ext(0x04)");
          _ok((uint)(CONCAT13(str[3],CONCAT12(str[2],CONCAT11(str[1],str[0]))) ==
                    *(int *)(local_38 + 1)),"memcmp(s1, s2, 0x04) == 0",
              "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
              ,0x255,"mp_encode_ext(x, 0x04) == x");
          _space((FILE *)_stdout);
          fwrite("# ",2,1,_stdout);
          fwrite("ext len=0x05",0xc,1,_stdout);
          fputc(10,_stdout);
          do {
            str[lVar8] = (char)lVar8 + 'a';
            lVar8 = lVar8 + 1;
          } while (lVar8 != 5);
          buf[1] = -0x39;
          buf[2] = '\x05';
          buf[3] = '\0';
          buf[8] = str[4];
          switch(0x1278a3) {
          case 0:
            uVar4 = 5;
            local_38 = buf + 3;
            break;
          case 1:
            uVar4 = 0x500;
            local_38 = buf + 4;
            break;
          case 2:
            uVar4 = (uint)(byte)buf[5] | (uint)(uint3)(CONCAT12(buf[4],5) >> 8) |
                    CONCAT13(buf[5],CONCAT12(buf[4],5)) << 0x18;
            local_38 = buf + 6;
            break;
          default:
            goto switchD_0012205d_caseD_ca;
          case 0xd:
          case 0xe:
          case 0xf:
          case 0x10:
          case 0x11:
            uVar4 = 0x80000;
            local_38 = buf + 2;
          }
          cVar1 = *local_38;
          _ok((uint)(uVar4 == 5),"0x05 == len2",
              "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
              ,0x256,"len(mp_decode_ext(x, %u))",5);
          _ok((uint)(cVar1 == '\0'),"ext_type == 0",
              "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
              ,0x256,"type(mp_decode_ext(x))");
          if ((byte)buf[1] - 199 < 0x12) {
            local_40 = (char *)((ulong)local_40 & 0xffffffffffffff00);
            switch((uint)(byte)buf[1]) {
            case 199:
              uVar4 = (uint)(byte)buf[2];
              pcVar9 = buf + 3;
              break;
            case 200:
              uVar4 = (uint)(ushort)(CONCAT11(buf[3],buf[2]) << 8 | (ushort)(byte)buf[3]);
              pcVar9 = buf + 4;
              break;
            case 0xc9:
              uVar2 = CONCAT12(buf[4],CONCAT11(buf[3],buf[2]));
              uVar4 = (uint)(byte)buf[5] | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 |
                      CONCAT13(buf[5],uVar2) << 0x18;
              pcVar9 = buf + 6;
              break;
            default:
              goto switchD_0012205d_caseD_ca;
            case 0xd4:
            case 0xd5:
            case 0xd6:
            case 0xd7:
            case 0xd8:
              uVar4 = 1 << (buf[1] + 0x2cU & 0x1f);
              pcVar9 = buf + 2;
            }
            _ok((uint)(uVar4 == 5),"0x05 == len2",
                "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                ,0x256,"len(mp_decode_strbin(x, %u))",5);
            local_50 = (byte *)(buf + 1);
            lVar8 = 1;
            do {
              lVar6 = (long)""[*local_50];
              if (lVar6 < 0) {
                if (*local_50 == 0xd9) {
                  local_50 = local_50 + (ulong)local_50[1] + 2;
                  goto LAB_00122f4a;
                }
                if (-0x20 < ""[*local_50]) {
                  lVar8 = lVar8 - lVar6;
                  local_50 = local_50 + 1;
                  goto LAB_00122f4a;
                }
                mp_next_slowpath((char **)&local_50,lVar8);
                bVar3 = false;
                lVar6 = lVar8;
              }
              else {
                local_50 = local_50 + 1 + lVar6;
LAB_00122f4a:
                bVar3 = true;
                lVar6 = lVar8;
              }
            } while ((bVar3) && (lVar8 = lVar6 + -1, 1 < lVar6));
            local_48 = buf + 1;
            iVar5 = mp_check(&local_48,(char *)(local_50 + 5));
            lVar8 = 0;
            _ok((uint)(iVar5 == 0),"!mp_check(&d4, d3 + 0x05)",
                "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                ,0x256,"mp_check_ext(mp_encode_ext(x, 0x05))");
            _ok((uint)(pcVar9 + uVar4 == buf + 8),"d1 == d2",
                "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                ,0x256,"len(mp_decode_ext(x, 0x05)");
            _ok((uint)(local_50 == (byte *)(buf + 9)),"d1 == d3",
                "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                ,0x256,"len(mp_next_ext(x, 0x05)");
            _ok((uint)(local_48 == buf + 9),"d1 == d4",
                "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                ,0x256,"len(mp_check_ext(x, 0x05)");
            _ok((uint)((char)local_40 == '\0'),"mp_sizeof_ext(0x05) == (uint32_t) (d1 - data)",
                "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                ,0x256,"mp_sizeof_ext(0x05)");
            _ok((uint)(str[4] == local_38[5] &&
                      CONCAT13(str[3],CONCAT12(str[2],CONCAT11(str[1],str[0]))) ==
                      *(int *)(local_38 + 1)),"memcmp(s1, s2, 0x05) == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                ,0x256,"mp_encode_ext(x, 0x05) == x");
            _space((FILE *)_stdout);
            fwrite("# ",2,1,_stdout);
            fwrite("ext len=0x06",0xc,1,_stdout);
            fputc(10,_stdout);
            do {
              str[lVar8] = (char)lVar8 + 'a';
              lVar8 = lVar8 + 1;
            } while (lVar8 != 6);
            buf[1] = -0x39;
            buf[2] = '\x06';
            buf[3] = '\0';
            switch(0x127925) {
            case 0:
              uVar4 = 6;
              local_38 = buf + 3;
              break;
            case 1:
              uVar4 = 0x600;
              local_38 = buf + 4;
              break;
            case 2:
              uVar4 = (uint)(byte)buf[5] | (uint)(uint3)(CONCAT12(buf[4],6) >> 8) |
                      CONCAT13(buf[5],CONCAT12(buf[4],6)) << 0x18;
              local_38 = buf + 6;
              break;
            default:
              goto switchD_0012205d_caseD_ca;
            case 0xd:
            case 0xe:
            case 0xf:
            case 0x10:
            case 0x11:
              uVar4 = 0x80000;
              local_38 = buf + 2;
            }
            cVar1 = *local_38;
            _ok((uint)(uVar4 == 6),"0x06 == len2",
                "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                ,599,"len(mp_decode_ext(x, %u))",6);
            _ok((uint)(cVar1 == '\0'),"ext_type == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                ,599,"type(mp_decode_ext(x))");
            if ((byte)buf[1] - 199 < 0x12) {
              local_40 = (char *)((ulong)local_40 & 0xffffffffffffff00);
              switch((uint)(byte)buf[1]) {
              case 199:
                uVar4 = (uint)(byte)buf[2];
                pcVar9 = buf + 3;
                break;
              case 200:
                uVar4 = (uint)(ushort)(CONCAT11(buf[3],buf[2]) << 8 | (ushort)(byte)buf[3]);
                pcVar9 = buf + 4;
                break;
              case 0xc9:
                uVar2 = CONCAT12(buf[4],CONCAT11(buf[3],buf[2]));
                uVar4 = (uint)(byte)buf[5] | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 |
                        CONCAT13(buf[5],uVar2) << 0x18;
                pcVar9 = buf + 6;
                break;
              default:
                goto switchD_0012205d_caseD_ca;
              case 0xd4:
              case 0xd5:
              case 0xd6:
              case 0xd7:
              case 0xd8:
                uVar4 = 1 << (buf[1] + 0x2cU & 0x1f);
                pcVar9 = buf + 2;
              }
              _ok((uint)(uVar4 == 6),"0x06 == len2",
                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                  ,599,"len(mp_decode_strbin(x, %u))",6);
              local_50 = (byte *)(buf + 1);
              lVar8 = 1;
              do {
                lVar6 = (long)""[*local_50];
                if (lVar6 < 0) {
                  if (*local_50 == 0xd9) {
                    local_50 = local_50 + (ulong)local_50[1] + 2;
                    goto LAB_001232cb;
                  }
                  if (-0x20 < ""[*local_50]) {
                    lVar8 = lVar8 - lVar6;
                    local_50 = local_50 + 1;
                    goto LAB_001232cb;
                  }
                  mp_next_slowpath((char **)&local_50,lVar8);
                  bVar3 = false;
                  lVar6 = lVar8;
                }
                else {
                  local_50 = local_50 + 1 + lVar6;
LAB_001232cb:
                  bVar3 = true;
                  lVar6 = lVar8;
                }
              } while ((bVar3) && (lVar8 = lVar6 + -1, 1 < lVar6));
              local_48 = buf + 1;
              iVar5 = mp_check(&local_48,(char *)(local_50 + 6));
              lVar8 = 0;
              _ok((uint)(iVar5 == 0),"!mp_check(&d4, d3 + 0x06)",
                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                  ,599,"mp_check_ext(mp_encode_ext(x, 0x06))");
              _ok((uint)(pcVar9 + uVar4 == buf + 9),"d1 == d2",
                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                  ,599,"len(mp_decode_ext(x, 0x06)");
              _ok((uint)(local_50 == (byte *)(buf + 10)),"d1 == d3",
                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                  ,599,"len(mp_next_ext(x, 0x06)");
              _ok((uint)(local_48 == buf + 10),"d1 == d4",
                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                  ,599,"len(mp_check_ext(x, 0x06)");
              _ok((uint)((char)local_40 == '\0'),"mp_sizeof_ext(0x06) == (uint32_t) (d1 - data)",
                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                  ,599,"mp_sizeof_ext(0x06)");
              _ok((uint)(CONCAT11(str[5],str[4]) == *(short *)(local_38 + 5) &&
                        CONCAT13(str[3],CONCAT12(str[2],CONCAT11(str[1],str[0]))) ==
                        *(int *)(local_38 + 1)),"memcmp(s1, s2, 0x06) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                  ,599,"mp_encode_ext(x, 0x06) == x");
              _space((FILE *)_stdout);
              fwrite("# ",2,1,_stdout);
              fwrite("ext len=0x07",0xc,1,_stdout);
              fputc(10,_stdout);
              do {
                str[lVar8] = (char)lVar8 + 'a';
                lVar8 = lVar8 + 1;
              } while (lVar8 != 7);
              buf[1] = -0x39;
              buf[2] = '\a';
              buf[3] = '\0';
              switch(0x1279a7) {
              case 0:
                uVar4 = 7;
                local_38 = buf + 3;
                break;
              case 1:
                uVar4 = 0x700;
                local_38 = buf + 4;
                break;
              case 2:
                uVar4 = (uint)(byte)buf[5] | (uint)(uint3)(CONCAT12(buf[4],7) >> 8) |
                        CONCAT13(buf[5],CONCAT12(buf[4],7)) << 0x18;
                local_38 = buf + 6;
                break;
              default:
                goto switchD_0012205d_caseD_ca;
              case 0xd:
              case 0xe:
              case 0xf:
              case 0x10:
              case 0x11:
                uVar4 = 0x80000;
                local_38 = buf + 2;
              }
              cVar1 = *local_38;
              _ok((uint)(uVar4 == 7),"0x07 == len2",
                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                  ,600,"len(mp_decode_ext(x, %u))",7);
              _ok((uint)(cVar1 == '\0'),"ext_type == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                  ,600,"type(mp_decode_ext(x))");
              if ((byte)buf[1] - 199 < 0x12) {
                local_40 = (char *)((ulong)local_40 & 0xffffffffffffff00);
                switch((uint)(byte)buf[1]) {
                case 199:
                  uVar4 = (uint)(byte)buf[2];
                  pcVar9 = buf + 3;
                  break;
                case 200:
                  uVar4 = (uint)(ushort)(CONCAT11(buf[3],buf[2]) << 8 | (ushort)(byte)buf[3]);
                  pcVar9 = buf + 4;
                  break;
                case 0xc9:
                  uVar2 = CONCAT12(buf[4],CONCAT11(buf[3],buf[2]));
                  uVar4 = (uint)(byte)buf[5] | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 |
                          CONCAT13(buf[5],uVar2) << 0x18;
                  pcVar9 = buf + 6;
                  break;
                default:
                  goto switchD_0012205d_caseD_ca;
                case 0xd4:
                case 0xd5:
                case 0xd6:
                case 0xd7:
                case 0xd8:
                  uVar4 = 1 << (buf[1] + 0x2cU & 0x1f);
                  pcVar9 = buf + 2;
                }
                _ok((uint)(uVar4 == 7),"0x07 == len2",
                    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                    ,600,"len(mp_decode_strbin(x, %u))",7);
                local_50 = (byte *)(buf + 1);
                lVar8 = 1;
                do {
                  lVar6 = (long)""[*local_50];
                  if (lVar6 < 0) {
                    if (*local_50 == 0xd9) {
                      local_50 = local_50 + (ulong)local_50[1] + 2;
                      goto LAB_0012364c;
                    }
                    if (-0x20 < ""[*local_50]) {
                      lVar8 = lVar8 - lVar6;
                      local_50 = local_50 + 1;
                      goto LAB_0012364c;
                    }
                    mp_next_slowpath((char **)&local_50,lVar8);
                    bVar3 = false;
                    lVar6 = lVar8;
                  }
                  else {
                    local_50 = local_50 + 1 + lVar6;
LAB_0012364c:
                    bVar3 = true;
                    lVar6 = lVar8;
                  }
                } while ((bVar3) && (lVar8 = lVar6 + -1, 1 < lVar6));
                local_48 = buf + 1;
                iVar5 = mp_check(&local_48,(char *)(local_50 + 7));
                lVar8 = 0;
                _ok((uint)(iVar5 == 0),"!mp_check(&d4, d3 + 0x07)",
                    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                    ,600,"mp_check_ext(mp_encode_ext(x, 0x07))");
                _ok((uint)(pcVar9 + uVar4 == buf + 10),"d1 == d2",
                    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                    ,600,"len(mp_decode_ext(x, 0x07)");
                _ok((uint)(local_50 == (byte *)(buf + 0xb)),"d1 == d3",
                    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                    ,600,"len(mp_next_ext(x, 0x07)");
                _ok((uint)(local_48 == buf + 0xb),"d1 == d4",
                    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                    ,600,"len(mp_check_ext(x, 0x07)");
                _ok((uint)((char)local_40 == '\0'),"mp_sizeof_ext(0x07) == (uint32_t) (d1 - data)",
                    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                    ,600,"mp_sizeof_ext(0x07)");
                _ok((uint)(CONCAT13(str[6],CONCAT12(str[5],CONCAT11(str[4],str[3]))) ==
                           *(int *)(local_38 + 4) &&
                          CONCAT13(str[3],CONCAT12(str[2],CONCAT11(str[1],str[0]))) ==
                          *(int *)(local_38 + 1)),"memcmp(s1, s2, 0x07) == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                    ,600,"mp_encode_ext(x, 0x07) == x");
                _space((FILE *)_stdout);
                fwrite("# ",2,1,_stdout);
                fwrite("ext len=0x08",0xc,1,_stdout);
                fputc(10,_stdout);
                do {
                  str[lVar8] = (char)lVar8 + 'a';
                  lVar8 = lVar8 + 1;
                } while (lVar8 != 8);
                buf[1] = 0xd7;
                buf[2] = '\0';
                switch(0x1238a2) {
                case 0:
                  uVar4 = 0;
                  local_38 = buf + 3;
                  break;
                case 1:
                  uVar4 = (uint)(byte)buf[3];
                  local_38 = buf + 4;
                  break;
                case 2:
                  uVar4 = (uint)(byte)buf[5] | CONCAT11(buf[4],buf[3]) & 0xff00 |
                          (CONCAT11(buf[4],buf[3]) & 0xff) << 0x10;
                  local_38 = buf + 6;
                  break;
                default:
                  goto switchD_0012205d_caseD_ca;
                case 0xd:
                case 0xe:
                case 0xf:
                case 0x10:
                case 0x11:
                  uVar4 = 8;
                  local_38 = buf + 2;
                }
                cVar1 = *local_38;
                _ok((uint)(uVar4 == 8),"0x08 == len2",
                    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                    ,0x259,"len(mp_decode_ext(x, %u))",8);
                _ok((uint)(cVar1 == '\0'),"ext_type == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                    ,0x259,"type(mp_decode_ext(x))");
                if ((byte)buf[1] - 199 < 0x12) {
                  local_40 = (char *)CONCAT71(local_40._1_7_,0xd7);
                  switch((uint)(byte)buf[1]) {
                  case 199:
                    uVar4 = (uint)(byte)buf[2];
                    pcVar9 = buf + 3;
                    break;
                  case 200:
                    uVar4 = (uint)(ushort)(CONCAT11(buf[3],buf[2]) << 8 | (ushort)(byte)buf[3]);
                    pcVar9 = buf + 4;
                    break;
                  case 0xc9:
                    uVar2 = CONCAT12(buf[4],CONCAT11(buf[3],buf[2]));
                    uVar4 = (uint)(byte)buf[5] | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 |
                            CONCAT13(buf[5],uVar2) << 0x18;
                    pcVar9 = buf + 6;
                    break;
                  default:
                    goto switchD_0012205d_caseD_ca;
                  case 0xd4:
                  case 0xd5:
                  case 0xd6:
                  case 0xd7:
                  case 0xd8:
                    uVar4 = 1 << (buf[1] + 0x2cU & 0x1f);
                    pcVar9 = buf + 2;
                  }
                  _ok((uint)(uVar4 == 8),"0x08 == len2",
                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                      ,0x259,"len(mp_decode_strbin(x, %u))",8);
                  local_50 = (byte *)(buf + 1);
                  lVar8 = 1;
                  do {
                    lVar6 = (long)""[*local_50];
                    if (lVar6 < 0) {
                      if (*local_50 == 0xd9) {
                        local_50 = local_50 + (ulong)local_50[1] + 2;
                        goto LAB_001239be;
                      }
                      if (-0x20 < ""[*local_50]) {
                        lVar8 = lVar8 - lVar6;
                        local_50 = local_50 + 1;
                        goto LAB_001239be;
                      }
                      mp_next_slowpath((char **)&local_50,lVar8);
                      bVar3 = false;
                      lVar6 = lVar8;
                    }
                    else {
                      local_50 = local_50 + 1 + lVar6;
LAB_001239be:
                      bVar3 = true;
                      lVar6 = lVar8;
                    }
                  } while ((bVar3) && (lVar8 = lVar6 + -1, 1 < lVar6));
                  local_48 = buf + 1;
                  iVar5 = mp_check(&local_48,(char *)(local_50 + 8));
                  lVar8 = 0;
                  _ok((uint)(iVar5 == 0),"!mp_check(&d4, d3 + 0x08)",
                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                      ,0x259,"mp_check_ext(mp_encode_ext(x, 0x08))");
                  _ok((uint)(pcVar9 + uVar4 == buf + 10),"d1 == d2",
                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                      ,0x259,"len(mp_decode_ext(x, 0x08)");
                  _ok((uint)(local_50 == (byte *)(buf + 0xb)),"d1 == d3",
                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                      ,0x259,"len(mp_next_ext(x, 0x08)");
                  _ok((uint)(local_48 == buf + 0xb),"d1 == d4",
                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                      ,0x259,"len(mp_check_ext(x, 0x08)");
                  _ok((uint)((char)local_40 != '\0'),"mp_sizeof_ext(0x08) == (uint32_t) (d1 - data)"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                      ,0x259,"mp_sizeof_ext(0x08)");
                  _ok((uint)(CONCAT17(str[7],CONCAT16(str[6],CONCAT15(str[5],CONCAT14(str[4],
                                                  CONCAT13(str[3],CONCAT12(str[2],CONCAT11(str[1],
                                                  str[0]))))))) == *(long *)(local_38 + 1)),
                      "memcmp(s1, s2, 0x08) == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                      ,0x259,"mp_encode_ext(x, 0x08) == x");
                  _space((FILE *)_stdout);
                  fwrite("# ",2,1,_stdout);
                  fwrite("ext len=0x09",0xc,1,_stdout);
                  fputc(10,_stdout);
                  do {
                    str[lVar8] = (char)lVar8 + 'a';
                    lVar8 = lVar8 + 1;
                  } while (lVar8 != 9);
                  buf[1] = -0x39;
                  buf[2] = '\t';
                  buf[3] = '\0';
                  buf[0xc] = str[8];
                  switch(0x127aab) {
                  case 0:
                    uVar4 = 9;
                    local_38 = buf + 3;
                    break;
                  case 1:
                    uVar4 = 0x900;
                    local_38 = buf + 4;
                    break;
                  case 2:
                    uVar4 = (uint)(byte)buf[5] | (uint)(uint3)(CONCAT12(buf[4],9) >> 8) |
                            CONCAT13(buf[5],CONCAT12(buf[4],9)) << 0x18;
                    local_38 = buf + 6;
                    break;
                  default:
                    goto switchD_0012205d_caseD_ca;
                  case 0xd:
                  case 0xe:
                  case 0xf:
                  case 0x10:
                  case 0x11:
                    uVar4 = 0x80000;
                    local_38 = buf + 2;
                  }
                  cVar1 = *local_38;
                  _ok((uint)(uVar4 == 9),"0x09 == len2",
                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                      ,0x25a,"len(mp_decode_ext(x, %u))",9);
                  _ok((uint)(cVar1 == '\0'),"ext_type == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                      ,0x25a,"type(mp_decode_ext(x))");
                  if ((byte)buf[1] - 199 < 0x12) {
                    local_40 = (char *)((ulong)local_40 & 0xffffffffffffff00);
                    switch((uint)(byte)buf[1]) {
                    case 199:
                      uVar4 = (uint)(byte)buf[2];
                      pcVar9 = buf + 3;
                      break;
                    case 200:
                      uVar4 = (uint)(ushort)(CONCAT11(buf[3],buf[2]) << 8 | (ushort)(byte)buf[3]);
                      pcVar9 = buf + 4;
                      break;
                    case 0xc9:
                      uVar2 = CONCAT12(buf[4],CONCAT11(buf[3],buf[2]));
                      uVar4 = (uint)(byte)buf[5] | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 |
                              CONCAT13(buf[5],uVar2) << 0x18;
                      pcVar9 = buf + 6;
                      break;
                    default:
                      goto switchD_0012205d_caseD_ca;
                    case 0xd4:
                    case 0xd5:
                    case 0xd6:
                    case 0xd7:
                    case 0xd8:
                      uVar4 = 1 << (buf[1] + 0x2cU & 0x1f);
                      pcVar9 = buf + 2;
                    }
                    _ok((uint)(uVar4 == 9),"0x09 == len2",
                        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                        ,0x25a,"len(mp_decode_strbin(x, %u))",9);
                    local_50 = (byte *)(buf + 1);
                    lVar8 = 1;
                    do {
                      lVar6 = (long)""[*local_50];
                      if (lVar6 < 0) {
                        if (*local_50 == 0xd9) {
                          local_50 = local_50 + (ulong)local_50[1] + 2;
                          goto LAB_00123d32;
                        }
                        if (-0x20 < ""[*local_50]) {
                          lVar8 = lVar8 - lVar6;
                          local_50 = local_50 + 1;
                          goto LAB_00123d32;
                        }
                        mp_next_slowpath((char **)&local_50,lVar8);
                        bVar3 = false;
                        lVar6 = lVar8;
                      }
                      else {
                        local_50 = local_50 + 1 + lVar6;
LAB_00123d32:
                        bVar3 = true;
                        lVar6 = lVar8;
                      }
                    } while ((bVar3) && (lVar8 = lVar6 + -1, 1 < lVar6));
                    local_48 = buf + 1;
                    iVar5 = mp_check(&local_48,(char *)(local_50 + 9));
                    lVar8 = 0;
                    _ok((uint)(iVar5 == 0),"!mp_check(&d4, d3 + 0x09)",
                        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                        ,0x25a,"mp_check_ext(mp_encode_ext(x, 0x09))");
                    _ok((uint)(pcVar9 + uVar4 == buf + 0xc),"d1 == d2",
                        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                        ,0x25a,"len(mp_decode_ext(x, 0x09)");
                    _ok((uint)(local_50 == (byte *)(buf + 0xd)),"d1 == d3",
                        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                        ,0x25a,"len(mp_next_ext(x, 0x09)");
                    _ok((uint)(local_48 == buf + 0xd),"d1 == d4",
                        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                        ,0x25a,"len(mp_check_ext(x, 0x09)");
                    _ok((uint)((char)local_40 == '\0'),
                        "mp_sizeof_ext(0x09) == (uint32_t) (d1 - data)",
                        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                        ,0x25a,"mp_sizeof_ext(0x09)");
                    _ok((uint)(str[8] == local_38[9] &&
                              CONCAT17(str[7],CONCAT16(str[6],CONCAT15(str[5],CONCAT14(str[4],
                                                  CONCAT13(str[3],CONCAT12(str[2],CONCAT11(str[1],
                                                  str[0]))))))) == *(long *)(local_38 + 1)),
                        "memcmp(s1, s2, 0x09) == 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                        ,0x25a,"mp_encode_ext(x, 0x09) == x");
                    _space((FILE *)_stdout);
                    fwrite("# ",2,1,_stdout);
                    fwrite("ext len=0x0a",0xc,1,_stdout);
                    fputc(10,_stdout);
                    do {
                      str[lVar8] = (char)lVar8 + 'a';
                      lVar8 = lVar8 + 1;
                    } while (lVar8 != 10);
                    buf[1] = -0x39;
                    buf[2] = '\n';
                    buf[3] = '\0';
                    switch(0x127b2d) {
                    case 0:
                      uVar4 = 10;
                      local_38 = buf + 3;
                      break;
                    case 1:
                      uVar4 = 0xa00;
                      local_38 = buf + 4;
                      break;
                    case 2:
                      uVar4 = (uint)(byte)buf[5] | (uint)(uint3)(CONCAT12(buf[4],10) >> 8) |
                              CONCAT13(buf[5],CONCAT12(buf[4],10)) << 0x18;
                      local_38 = buf + 6;
                      break;
                    default:
                      goto switchD_0012205d_caseD_ca;
                    case 0xd:
                    case 0xe:
                    case 0xf:
                    case 0x10:
                    case 0x11:
                      uVar4 = 0x80000;
                      local_38 = buf + 2;
                    }
                    cVar1 = *local_38;
                    _ok((uint)(uVar4 == 10),"0x0a == len2",
                        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                        ,0x25b,"len(mp_decode_ext(x, %u))",10);
                    _ok((uint)(cVar1 == '\0'),"ext_type == 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                        ,0x25b,"type(mp_decode_ext(x))");
                    if ((byte)buf[1] - 199 < 0x12) {
                      local_40 = (char *)((ulong)local_40 & 0xffffffffffffff00);
                      switch((uint)(byte)buf[1]) {
                      case 199:
                        uVar4 = (uint)(byte)buf[2];
                        pcVar9 = buf + 3;
                        break;
                      case 200:
                        uVar4 = (uint)(ushort)(CONCAT11(buf[3],buf[2]) << 8 | (ushort)(byte)buf[3]);
                        pcVar9 = buf + 4;
                        break;
                      case 0xc9:
                        uVar2 = CONCAT12(buf[4],CONCAT11(buf[3],buf[2]));
                        uVar4 = (uint)(byte)buf[5] | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8
                                | CONCAT13(buf[5],uVar2) << 0x18;
                        pcVar9 = buf + 6;
                        break;
                      default:
                        goto switchD_0012205d_caseD_ca;
                      case 0xd4:
                      case 0xd5:
                      case 0xd6:
                      case 0xd7:
                      case 0xd8:
                        uVar4 = 1 << (buf[1] + 0x2cU & 0x1f);
                        pcVar9 = buf + 2;
                      }
                      _ok((uint)(uVar4 == 10),"0x0a == len2",
                          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                          ,0x25b,"len(mp_decode_strbin(x, %u))",10);
                      local_50 = (byte *)(buf + 1);
                      lVar8 = 1;
                      do {
                        lVar6 = (long)""[*local_50];
                        if (lVar6 < 0) {
                          if (*local_50 == 0xd9) {
                            local_50 = local_50 + (ulong)local_50[1] + 2;
                            goto LAB_001240b7;
                          }
                          if (-0x20 < ""[*local_50]) {
                            lVar8 = lVar8 - lVar6;
                            local_50 = local_50 + 1;
                            goto LAB_001240b7;
                          }
                          mp_next_slowpath((char **)&local_50,lVar8);
                          bVar3 = false;
                          lVar6 = lVar8;
                        }
                        else {
                          local_50 = local_50 + 1 + lVar6;
LAB_001240b7:
                          bVar3 = true;
                          lVar6 = lVar8;
                        }
                      } while ((bVar3) && (lVar8 = lVar6 + -1, 1 < lVar6));
                      local_48 = buf + 1;
                      iVar5 = mp_check(&local_48,(char *)(local_50 + 10));
                      lVar8 = 0;
                      _ok((uint)(iVar5 == 0),"!mp_check(&d4, d3 + 0x0a)",
                          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                          ,0x25b,"mp_check_ext(mp_encode_ext(x, 0x0a))");
                      _ok((uint)(pcVar9 + uVar4 == buf + 0xd),"d1 == d2",
                          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                          ,0x25b,"len(mp_decode_ext(x, 0x0a)");
                      _ok((uint)(local_50 == (byte *)(buf + 0xe)),"d1 == d3",
                          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                          ,0x25b,"len(mp_next_ext(x, 0x0a)");
                      _ok((uint)(local_48 == buf + 0xe),"d1 == d4",
                          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                          ,0x25b,"len(mp_check_ext(x, 0x0a)");
                      _ok((uint)((char)local_40 == '\0'),
                          "mp_sizeof_ext(0x0a) == (uint32_t) (d1 - data)",
                          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                          ,0x25b,"mp_sizeof_ext(0x0a)");
                      _ok((uint)(CONCAT11(str[9],str[8]) == *(short *)(local_38 + 9) &&
                                CONCAT17(str[7],CONCAT16(str[6],CONCAT15(str[5],CONCAT14(str[4],
                                                  CONCAT13(str[3],CONCAT12(str[2],CONCAT11(str[1],
                                                  str[0]))))))) == *(long *)(local_38 + 1)),
                          "memcmp(s1, s2, 0x0a) == 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                          ,0x25b,"mp_encode_ext(x, 0x0a) == x");
                      _space((FILE *)_stdout);
                      fwrite("# ",2,1,_stdout);
                      fwrite("ext len=0x0b",0xc,1,_stdout);
                      fputc(10,_stdout);
                      do {
                        str[lVar8] = (char)lVar8 + 'a';
                        lVar8 = lVar8 + 1;
                      } while (lVar8 != 0xb);
                      buf[1] = -0x39;
                      buf[2] = '\v';
                      buf[3] = '\0';
                      switch(0x127baf) {
                      case 0:
                        uVar4 = 0xb;
                        local_38 = buf + 3;
                        break;
                      case 1:
                        uVar4 = 0xb00;
                        local_38 = buf + 4;
                        break;
                      case 2:
                        uVar4 = (uint)(byte)buf[5] | (uint)(uint3)(CONCAT12(buf[4],0xb) >> 8) |
                                CONCAT13(buf[5],CONCAT12(buf[4],0xb)) << 0x18;
                        local_38 = buf + 6;
                        break;
                      default:
                        goto switchD_0012205d_caseD_ca;
                      case 0xd:
                      case 0xe:
                      case 0xf:
                      case 0x10:
                      case 0x11:
                        uVar4 = 0x80000;
                        local_38 = buf + 2;
                      }
                      cVar1 = *local_38;
                      _ok((uint)(uVar4 == 0xb),"0x0b == len2",
                          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                          ,0x25c,"len(mp_decode_ext(x, %u))",0xb);
                      _ok((uint)(cVar1 == '\0'),"ext_type == 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                          ,0x25c,"type(mp_decode_ext(x))");
                      if ((byte)buf[1] - 199 < 0x12) {
                        local_40 = (char *)((ulong)local_40 & 0xffffffffffffff00);
                        switch((uint)(byte)buf[1]) {
                        case 199:
                          uVar4 = (uint)(byte)buf[2];
                          pcVar9 = buf + 3;
                          break;
                        case 200:
                          uVar4 = (uint)(ushort)(CONCAT11(buf[3],buf[2]) << 8 | (ushort)(byte)buf[3]
                                                );
                          pcVar9 = buf + 4;
                          break;
                        case 0xc9:
                          uVar2 = CONCAT12(buf[4],CONCAT11(buf[3],buf[2]));
                          uVar4 = (uint)(byte)buf[5] | (uVar2 & 0xff0000) >> 8 |
                                  (uVar2 & 0xff00) << 8 | CONCAT13(buf[5],uVar2) << 0x18;
                          pcVar9 = buf + 6;
                          break;
                        default:
                          goto switchD_0012205d_caseD_ca;
                        case 0xd4:
                        case 0xd5:
                        case 0xd6:
                        case 0xd7:
                        case 0xd8:
                          uVar4 = 1 << (buf[1] + 0x2cU & 0x1f);
                          pcVar9 = buf + 2;
                        }
                        _ok((uint)(uVar4 == 0xb),"0x0b == len2",
                            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                            ,0x25c,"len(mp_decode_strbin(x, %u))",0xb);
                        local_50 = (byte *)(buf + 1);
                        lVar8 = 1;
                        do {
                          lVar6 = (long)""[*local_50];
                          if (lVar6 < 0) {
                            if (*local_50 == 0xd9) {
                              local_50 = local_50 + (ulong)local_50[1] + 2;
                              goto LAB_0012443c;
                            }
                            if (-0x20 < ""[*local_50]) {
                              lVar8 = lVar8 - lVar6;
                              local_50 = local_50 + 1;
                              goto LAB_0012443c;
                            }
                            mp_next_slowpath((char **)&local_50,lVar8);
                            bVar3 = false;
                            lVar6 = lVar8;
                          }
                          else {
                            local_50 = local_50 + 1 + lVar6;
LAB_0012443c:
                            bVar3 = true;
                            lVar6 = lVar8;
                          }
                        } while ((bVar3) && (lVar8 = lVar6 + -1, 1 < lVar6));
                        local_48 = buf + 1;
                        iVar5 = mp_check(&local_48,(char *)(local_50 + 0xb));
                        lVar8 = 0;
                        _ok((uint)(iVar5 == 0),"!mp_check(&d4, d3 + 0x0b)",
                            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                            ,0x25c,"mp_check_ext(mp_encode_ext(x, 0x0b))");
                        _ok((uint)(pcVar9 + uVar4 == buf + 0xe),"d1 == d2",
                            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                            ,0x25c,"len(mp_decode_ext(x, 0x0b)");
                        _ok((uint)(local_50 == (byte *)(buf + 0xf)),"d1 == d3",
                            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                            ,0x25c,"len(mp_next_ext(x, 0x0b)");
                        _ok((uint)(local_48 == buf + 0xf),"d1 == d4",
                            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                            ,0x25c,"len(mp_check_ext(x, 0x0b)");
                        _ok((uint)((char)local_40 == '\0'),
                            "mp_sizeof_ext(0x0b) == (uint32_t) (d1 - data)",
                            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                            ,0x25c,"mp_sizeof_ext(0x0b)");
                        _ok((uint)(CONCAT17(str[10],CONCAT16(str[9],CONCAT15(str[8],CONCAT14(str[7],
                                                  CONCAT13(str[6],CONCAT12(str[5],CONCAT11(str[4],
                                                  str[3]))))))) == *(long *)(local_38 + 4) &&
                                  CONCAT17(str[7],CONCAT16(str[6],CONCAT15(str[5],CONCAT14(str[4],
                                                  CONCAT13(str[3],CONCAT12(str[2],CONCAT11(str[1],
                                                  str[0]))))))) == *(long *)(local_38 + 1)),
                            "memcmp(s1, s2, 0x0b) == 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                            ,0x25c,"mp_encode_ext(x, 0x0b) == x");
                        _space((FILE *)_stdout);
                        fwrite("# ",2,1,_stdout);
                        fwrite("ext len=0x0c",0xc,1,_stdout);
                        fputc(10,_stdout);
                        do {
                          str[lVar8] = (char)lVar8 + 'a';
                          lVar8 = lVar8 + 1;
                        } while (lVar8 != 0xc);
                        buf[1] = -0x39;
                        buf[2] = '\f';
                        buf[3] = '\0';
                        switch(0x127c31) {
                        case 0:
                          uVar4 = 0xc;
                          local_38 = buf + 3;
                          break;
                        case 1:
                          uVar4 = 0xc00;
                          local_38 = buf + 4;
                          break;
                        case 2:
                          uVar4 = (uint)(byte)buf[5] | (uint)(uint3)(CONCAT12(buf[4],0xc) >> 8) |
                                  CONCAT13(buf[5],CONCAT12(buf[4],0xc)) << 0x18;
                          local_38 = buf + 6;
                          break;
                        default:
                          goto switchD_0012205d_caseD_ca;
                        case 0xd:
                        case 0xe:
                        case 0xf:
                        case 0x10:
                        case 0x11:
                          uVar4 = 0x80000;
                          local_38 = buf + 2;
                        }
                        cVar1 = *local_38;
                        _ok((uint)(uVar4 == 0xc),"0x0c == len2",
                            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                            ,0x25d,"len(mp_decode_ext(x, %u))",0xc);
                        _ok((uint)(cVar1 == '\0'),"ext_type == 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                            ,0x25d,"type(mp_decode_ext(x))");
                        if ((byte)buf[1] - 199 < 0x12) {
                          local_40 = (char *)((ulong)local_40 & 0xffffffffffffff00);
                          switch((uint)(byte)buf[1]) {
                          case 199:
                            uVar4 = (uint)(byte)buf[2];
                            pcVar9 = buf + 3;
                            break;
                          case 200:
                            uVar4 = (uint)(ushort)(CONCAT11(buf[3],buf[2]) << 8 |
                                                  (ushort)(byte)buf[3]);
                            pcVar9 = buf + 4;
                            break;
                          case 0xc9:
                            uVar2 = CONCAT12(buf[4],CONCAT11(buf[3],buf[2]));
                            uVar4 = (uint)(byte)buf[5] | (uVar2 & 0xff0000) >> 8 |
                                    (uVar2 & 0xff00) << 8 | CONCAT13(buf[5],uVar2) << 0x18;
                            pcVar9 = buf + 6;
                            break;
                          default:
                            goto switchD_0012205d_caseD_ca;
                          case 0xd4:
                          case 0xd5:
                          case 0xd6:
                          case 0xd7:
                          case 0xd8:
                            uVar4 = 1 << (buf[1] + 0x2cU & 0x1f);
                            pcVar9 = buf + 2;
                          }
                          _ok((uint)(uVar4 == 0xc),"0x0c == len2",
                              "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                              ,0x25d,"len(mp_decode_strbin(x, %u))",0xc);
                          local_50 = (byte *)(buf + 1);
                          lVar8 = 1;
                          do {
                            lVar6 = (long)""[*local_50];
                            if (lVar6 < 0) {
                              if (*local_50 == 0xd9) {
                                local_50 = local_50 + (ulong)local_50[1] + 2;
                                goto LAB_001247be;
                              }
                              if (-0x20 < ""[*local_50]) {
                                lVar8 = lVar8 - lVar6;
                                local_50 = local_50 + 1;
                                goto LAB_001247be;
                              }
                              mp_next_slowpath((char **)&local_50,lVar8);
                              bVar3 = false;
                              lVar6 = lVar8;
                            }
                            else {
                              local_50 = local_50 + 1 + lVar6;
LAB_001247be:
                              bVar3 = true;
                              lVar6 = lVar8;
                            }
                          } while ((bVar3) && (lVar8 = lVar6 + -1, 1 < lVar6));
                          local_48 = buf + 1;
                          iVar5 = mp_check(&local_48,(char *)(local_50 + 0xc));
                          lVar8 = 0;
                          _ok((uint)(iVar5 == 0),"!mp_check(&d4, d3 + 0x0c)",
                              "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                              ,0x25d,"mp_check_ext(mp_encode_ext(x, 0x0c))");
                          _ok((uint)(pcVar9 + uVar4 == buf + 0xf),"d1 == d2",
                              "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                              ,0x25d,"len(mp_decode_ext(x, 0x0c)");
                          _ok((uint)(local_50 == (byte *)(buf + 0x10)),"d1 == d3",
                              "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                              ,0x25d,"len(mp_next_ext(x, 0x0c)");
                          _ok((uint)(local_48 == buf + 0x10),"d1 == d4",
                              "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                              ,0x25d,"len(mp_check_ext(x, 0x0c)");
                          _ok((uint)((char)local_40 == '\0'),
                              "mp_sizeof_ext(0x0c) == (uint32_t) (d1 - data)",
                              "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                              ,0x25d,"mp_sizeof_ext(0x0c)");
                          _ok((uint)(CONCAT13(str[0xb],CONCAT12(str[10],CONCAT11(str[9],str[8]))) ==
                                     *(int *)(local_38 + 9) &&
                                    CONCAT17(str[7],CONCAT16(str[6],CONCAT15(str[5],CONCAT14(str[4],
                                                  CONCAT13(str[3],CONCAT12(str[2],CONCAT11(str[1],
                                                  str[0]))))))) == *(long *)(local_38 + 1)),
                              "memcmp(s1, s2, 0x0c) == 0",
                              "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                              ,0x25d,"mp_encode_ext(x, 0x0c) == x");
                          _space((FILE *)_stdout);
                          fwrite("# ",2,1,_stdout);
                          fwrite("ext len=0x0d",0xc,1,_stdout);
                          fputc(10,_stdout);
                          do {
                            str[lVar8] = (char)lVar8 + 'a';
                            lVar8 = lVar8 + 1;
                          } while (lVar8 != 0xd);
                          buf[1] = -0x39;
                          buf[2] = '\r';
                          buf[3] = '\0';
                          switch(0x127cb3) {
                          case 0:
                            uVar4 = 0xd;
                            local_38 = buf + 3;
                            break;
                          case 1:
                            uVar4 = 0xd00;
                            local_38 = buf + 4;
                            break;
                          case 2:
                            uVar4 = (uint)(byte)buf[5] | (uint)(uint3)(CONCAT12(buf[4],0xd) >> 8) |
                                    CONCAT13(buf[5],CONCAT12(buf[4],0xd)) << 0x18;
                            local_38 = buf + 6;
                            break;
                          default:
                            goto switchD_0012205d_caseD_ca;
                          case 0xd:
                          case 0xe:
                          case 0xf:
                          case 0x10:
                          case 0x11:
                            uVar4 = 0x80000;
                            local_38 = buf + 2;
                          }
                          cVar1 = *local_38;
                          _ok((uint)(uVar4 == 0xd),"0x0d == len2",
                              "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                              ,0x25e,"len(mp_decode_ext(x, %u))",0xd);
                          _ok((uint)(cVar1 == '\0'),"ext_type == 0",
                              "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                              ,0x25e,"type(mp_decode_ext(x))");
                          if ((byte)buf[1] - 199 < 0x12) {
                            local_40 = (char *)((ulong)local_40 & 0xffffffffffffff00);
                            switch((uint)(byte)buf[1]) {
                            case 199:
                              uVar4 = (uint)(byte)buf[2];
                              pcVar9 = buf + 3;
                              break;
                            case 200:
                              uVar4 = (uint)(ushort)(CONCAT11(buf[3],buf[2]) << 8 |
                                                    (ushort)(byte)buf[3]);
                              pcVar9 = buf + 4;
                              break;
                            case 0xc9:
                              uVar2 = CONCAT12(buf[4],CONCAT11(buf[3],buf[2]));
                              uVar4 = (uint)(byte)buf[5] | (uVar2 & 0xff0000) >> 8 |
                                      (uVar2 & 0xff00) << 8 | CONCAT13(buf[5],uVar2) << 0x18;
                              pcVar9 = buf + 6;
                              break;
                            default:
                              goto switchD_0012205d_caseD_ca;
                            case 0xd4:
                            case 0xd5:
                            case 0xd6:
                            case 0xd7:
                            case 0xd8:
                              uVar4 = 1 << (buf[1] + 0x2cU & 0x1f);
                              pcVar9 = buf + 2;
                            }
                            _ok((uint)(uVar4 == 0xd),"0x0d == len2",
                                "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                                ,0x25e,"len(mp_decode_strbin(x, %u))",0xd);
                            local_50 = (byte *)(buf + 1);
                            lVar8 = 1;
                            do {
                              lVar6 = (long)""[*local_50];
                              if (lVar6 < 0) {
                                if (*local_50 == 0xd9) {
                                  local_50 = local_50 + (ulong)local_50[1] + 2;
                                  goto LAB_00124b3f;
                                }
                                if (-0x20 < ""[*local_50]) {
                                  lVar8 = lVar8 - lVar6;
                                  local_50 = local_50 + 1;
                                  goto LAB_00124b3f;
                                }
                                mp_next_slowpath((char **)&local_50,lVar8);
                                bVar3 = false;
                                lVar6 = lVar8;
                              }
                              else {
                                local_50 = local_50 + 1 + lVar6;
LAB_00124b3f:
                                bVar3 = true;
                                lVar6 = lVar8;
                              }
                            } while ((bVar3) && (lVar8 = lVar6 + -1, 1 < lVar6));
                            local_48 = buf + 1;
                            iVar5 = mp_check(&local_48,(char *)(local_50 + 0xd));
                            lVar8 = 0;
                            _ok((uint)(iVar5 == 0),"!mp_check(&d4, d3 + 0x0d)",
                                "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                                ,0x25e,"mp_check_ext(mp_encode_ext(x, 0x0d))");
                            _ok((uint)(pcVar9 + uVar4 == buf + 0x10),"d1 == d2",
                                "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                                ,0x25e,"len(mp_decode_ext(x, 0x0d)");
                            _ok((uint)(local_50 == (byte *)(buf + 0x11)),"d1 == d3",
                                "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                                ,0x25e,"len(mp_next_ext(x, 0x0d)");
                            _ok((uint)(local_48 == buf + 0x11),"d1 == d4",
                                "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                                ,0x25e,"len(mp_check_ext(x, 0x0d)");
                            _ok((uint)((char)local_40 == '\0'),
                                "mp_sizeof_ext(0x0d) == (uint32_t) (d1 - data)",
                                "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                                ,0x25e,"mp_sizeof_ext(0x0d)");
                            _ok((uint)(CONCAT17(str[0xc],CONCAT16(str[0xb],CONCAT15(str[10],CONCAT14
                                                  (str[9],CONCAT13(str[8],CONCAT12(str[7],CONCAT11(
                                                  str[6],str[5]))))))) == *(long *)(local_38 + 6) &&
                                      CONCAT17(str[7],CONCAT16(str[6],CONCAT15(str[5],CONCAT14(str[4
                                                  ],CONCAT13(str[3],CONCAT12(str[2],CONCAT11(str[1],
                                                  str[0]))))))) == *(long *)(local_38 + 1)),
                                "memcmp(s1, s2, 0x0d) == 0",
                                "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                                ,0x25e,"mp_encode_ext(x, 0x0d) == x");
                            _space((FILE *)_stdout);
                            fwrite("# ",2,1,_stdout);
                            fwrite("ext len=0x0e",0xc,1,_stdout);
                            fputc(10,_stdout);
                            do {
                              str[lVar8] = (char)lVar8 + 'a';
                              lVar8 = lVar8 + 1;
                            } while (lVar8 != 0xe);
                            buf[1] = -0x39;
                            buf[2] = '\x0e';
                            buf[3] = '\0';
                            switch(0x127d35) {
                            case 0:
                              uVar4 = 0xe;
                              local_38 = buf + 3;
                              break;
                            case 1:
                              uVar4 = 0xe00;
                              local_38 = buf + 4;
                              break;
                            case 2:
                              uVar4 = (uint)(byte)buf[5] | (uint)(uint3)(CONCAT12(buf[4],0xe) >> 8)
                                      | CONCAT13(buf[5],CONCAT12(buf[4],0xe)) << 0x18;
                              local_38 = buf + 6;
                              break;
                            default:
                              goto switchD_0012205d_caseD_ca;
                            case 0xd:
                            case 0xe:
                            case 0xf:
                            case 0x10:
                            case 0x11:
                              uVar4 = 0x80000;
                              local_38 = buf + 2;
                            }
                            cVar1 = *local_38;
                            _ok((uint)(uVar4 == 0xe),"0x0e == len2",
                                "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                                ,0x25f,"len(mp_decode_ext(x, %u))",0xe);
                            _ok((uint)(cVar1 == '\0'),"ext_type == 0",
                                "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                                ,0x25f,"type(mp_decode_ext(x))");
                            if ((byte)buf[1] - 199 < 0x12) {
                              local_40 = (char *)((ulong)local_40 & 0xffffffffffffff00);
                              switch((uint)(byte)buf[1]) {
                              case 199:
                                uVar4 = (uint)(byte)buf[2];
                                pcVar9 = buf + 3;
                                break;
                              case 200:
                                uVar4 = (uint)(ushort)(CONCAT11(buf[3],buf[2]) << 8 |
                                                      (ushort)(byte)buf[3]);
                                pcVar9 = buf + 4;
                                break;
                              case 0xc9:
                                uVar2 = CONCAT12(buf[4],CONCAT11(buf[3],buf[2]));
                                uVar4 = (uint)(byte)buf[5] | (uVar2 & 0xff0000) >> 8 |
                                        (uVar2 & 0xff00) << 8 | CONCAT13(buf[5],uVar2) << 0x18;
                                pcVar9 = buf + 6;
                                break;
                              default:
                                goto switchD_0012205d_caseD_ca;
                              case 0xd4:
                              case 0xd5:
                              case 0xd6:
                              case 0xd7:
                              case 0xd8:
                                uVar4 = 1 << (buf[1] + 0x2cU & 0x1f);
                                pcVar9 = buf + 2;
                              }
                              _ok((uint)(uVar4 == 0xe),"0x0e == len2",
                                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                                  ,0x25f,"len(mp_decode_strbin(x, %u))",0xe);
                              local_50 = (byte *)(buf + 1);
                              lVar8 = 1;
                              do {
                                lVar6 = (long)""[*local_50];
                                if (lVar6 < 0) {
                                  if (*local_50 == 0xd9) {
                                    local_50 = local_50 + (ulong)local_50[1] + 2;
                                    goto LAB_00124ec2;
                                  }
                                  if (-0x20 < ""[*local_50]) {
                                    lVar8 = lVar8 - lVar6;
                                    local_50 = local_50 + 1;
                                    goto LAB_00124ec2;
                                  }
                                  mp_next_slowpath((char **)&local_50,lVar8);
                                  bVar3 = false;
                                  lVar6 = lVar8;
                                }
                                else {
                                  local_50 = local_50 + 1 + lVar6;
LAB_00124ec2:
                                  bVar3 = true;
                                  lVar6 = lVar8;
                                }
                              } while ((bVar3) && (lVar8 = lVar6 + -1, 1 < lVar6));
                              local_48 = buf + 1;
                              iVar5 = mp_check(&local_48,(char *)(local_50 + 0xe));
                              lVar8 = 0;
                              _ok((uint)(iVar5 == 0),"!mp_check(&d4, d3 + 0x0e)",
                                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                                  ,0x25f,"mp_check_ext(mp_encode_ext(x, 0x0e))");
                              _ok((uint)(pcVar9 + uVar4 == buf + 0x11),"d1 == d2",
                                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                                  ,0x25f,"len(mp_decode_ext(x, 0x0e)");
                              _ok((uint)(local_50 == (byte *)(buf + 0x12)),"d1 == d3",
                                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                                  ,0x25f,"len(mp_next_ext(x, 0x0e)");
                              _ok((uint)(local_48 == buf + 0x12),"d1 == d4",
                                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                                  ,0x25f,"len(mp_check_ext(x, 0x0e)");
                              _ok((uint)((char)local_40 == '\0'),
                                  "mp_sizeof_ext(0x0e) == (uint32_t) (d1 - data)",
                                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                                  ,0x25f,"mp_sizeof_ext(0x0e)");
                              _ok((uint)(CONCAT17(str[0xd],CONCAT16(str[0xc],CONCAT15(str[0xb],
                                                  CONCAT14(str[10],CONCAT13(str[9],CONCAT12(str[8],
                                                  CONCAT11(str[7],str[6]))))))) ==
                                         *(long *)(local_38 + 7) &&
                                        CONCAT17(str[7],CONCAT16(str[6],CONCAT15(str[5],CONCAT14(str
                                                  [4],CONCAT13(str[3],CONCAT12(str[2],CONCAT11(str[1
                                                  ],str[0]))))))) == *(long *)(local_38 + 1)),
                                  "memcmp(s1, s2, 0x0e) == 0",
                                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                                  ,0x25f,"mp_encode_ext(x, 0x0e) == x");
                              _space((FILE *)_stdout);
                              fwrite("# ",2,1,_stdout);
                              fwrite("ext len=0x0f",0xc,1,_stdout);
                              fputc(10,_stdout);
                              do {
                                str[lVar8] = (char)lVar8 + 'a';
                                lVar8 = lVar8 + 1;
                              } while (lVar8 != 0xf);
                              buf[1] = -0x39;
                              buf[2] = '\x0f';
                              buf[3] = '\0';
                              switch(0x127db7) {
                              case 0:
                                uVar4 = 0xf;
                                local_38 = buf + 3;
                                break;
                              case 1:
                                uVar4 = 0xf00;
                                local_38 = buf + 4;
                                break;
                              case 2:
                                uVar4 = (uint)(byte)buf[5] |
                                        (uint)(uint3)(CONCAT12(buf[4],0xf) >> 8) |
                                        CONCAT13(buf[5],CONCAT12(buf[4],0xf)) << 0x18;
                                local_38 = buf + 6;
                                break;
                              default:
                                goto switchD_0012205d_caseD_ca;
                              case 0xd:
                              case 0xe:
                              case 0xf:
                              case 0x10:
                              case 0x11:
                                uVar4 = 0x80000;
                                local_38 = buf + 2;
                              }
                              cVar1 = *local_38;
                              _ok((uint)(uVar4 == 0xf),"0x0f == len2",
                                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                                  ,0x260,"len(mp_decode_ext(x, %u))",0xf);
                              _ok((uint)(cVar1 == '\0'),"ext_type == 0",
                                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                                  ,0x260,"type(mp_decode_ext(x))");
                              if ((byte)buf[1] - 199 < 0x12) {
                                local_40 = (char *)((ulong)local_40 & 0xffffffffffffff00);
                                switch((uint)(byte)buf[1]) {
                                case 199:
                                  uVar4 = (uint)(byte)buf[2];
                                  pcVar9 = buf + 3;
                                  break;
                                case 200:
                                  uVar4 = (uint)(ushort)(CONCAT11(buf[3],buf[2]) << 8 |
                                                        (ushort)(byte)buf[3]);
                                  pcVar9 = buf + 4;
                                  break;
                                case 0xc9:
                                  uVar2 = CONCAT12(buf[4],CONCAT11(buf[3],buf[2]));
                                  uVar4 = (uint)(byte)buf[5] | (uVar2 & 0xff0000) >> 8 |
                                          (uVar2 & 0xff00) << 8 | CONCAT13(buf[5],uVar2) << 0x18;
                                  pcVar9 = buf + 6;
                                  break;
                                default:
                                  goto switchD_0012205d_caseD_ca;
                                case 0xd4:
                                case 0xd5:
                                case 0xd6:
                                case 0xd7:
                                case 0xd8:
                                  uVar4 = 1 << (buf[1] + 0x2cU & 0x1f);
                                  pcVar9 = buf + 2;
                                }
                                _ok((uint)(uVar4 == 0xf),"0x0f == len2",
                                    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                                    ,0x260,"len(mp_decode_strbin(x, %u))",0xf);
                                local_50 = (byte *)(buf + 1);
                                lVar8 = 1;
                                do {
                                  lVar6 = (long)""[*local_50];
                                  if (lVar6 < 0) {
                                    if (*local_50 == 0xd9) {
                                      local_50 = local_50 + (ulong)local_50[1] + 2;
                                      goto LAB_00125245;
                                    }
                                    if (-0x20 < ""[*local_50]) {
                                      lVar8 = lVar8 - lVar6;
                                      local_50 = local_50 + 1;
                                      goto LAB_00125245;
                                    }
                                    mp_next_slowpath((char **)&local_50,lVar8);
                                    bVar3 = false;
                                    lVar6 = lVar8;
                                  }
                                  else {
                                    local_50 = local_50 + 1 + lVar6;
LAB_00125245:
                                    bVar3 = true;
                                    lVar6 = lVar8;
                                  }
                                } while ((bVar3) && (lVar8 = lVar6 + -1, 1 < lVar6));
                                local_48 = buf + 1;
                                iVar5 = mp_check(&local_48,(char *)(local_50 + 0xf));
                                lVar8 = 0;
                                _ok((uint)(iVar5 == 0),"!mp_check(&d4, d3 + 0x0f)",
                                    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                                    ,0x260,"mp_check_ext(mp_encode_ext(x, 0x0f))");
                                _ok((uint)(pcVar9 + uVar4 == buf + 0x12),"d1 == d2",
                                    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                                    ,0x260,"len(mp_decode_ext(x, 0x0f)");
                                _ok((uint)(local_50 == (byte *)(buf + 0x13)),"d1 == d3",
                                    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                                    ,0x260,"len(mp_next_ext(x, 0x0f)");
                                _ok((uint)(local_48 == buf + 0x13),"d1 == d4",
                                    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                                    ,0x260,"len(mp_check_ext(x, 0x0f)");
                                _ok((uint)((char)local_40 == '\0'),
                                    "mp_sizeof_ext(0x0f) == (uint32_t) (d1 - data)",
                                    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                                    ,0x260,"mp_sizeof_ext(0x0f)");
                                _ok((uint)(CONCAT17(str[0xe],CONCAT16(str[0xd],CONCAT15(str[0xc],
                                                  CONCAT14(str[0xb],CONCAT13(str[10],CONCAT12(str[9]
                                                  ,CONCAT11(str[8],str[7]))))))) ==
                                           *(long *)(local_38 + 8) &&
                                          CONCAT17(str[7],CONCAT16(str[6],CONCAT15(str[5],CONCAT14(
                                                  str[4],CONCAT13(str[3],CONCAT12(str[2],CONCAT11(
                                                  str[1],str[0]))))))) == *(long *)(local_38 + 1)),
                                    "memcmp(s1, s2, 0x0f) == 0",
                                    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                                    ,0x260,"mp_encode_ext(x, 0x0f) == x");
                                _space((FILE *)_stdout);
                                fwrite("# ",2,1,_stdout);
                                fwrite("ext len=0x10",0xc,1,_stdout);
                                fputc(10,_stdout);
                                do {
                                  str[lVar8] = (char)lVar8 + 'a';
                                  lVar8 = lVar8 + 1;
                                } while (lVar8 != 0x10);
                                buf[1] = 0xd8;
                                buf[2] = '\0';
                                switch(0x1254a3) {
                                case 0:
                                  uVar4 = 0;
                                  local_38 = buf + 3;
                                  break;
                                case 1:
                                  uVar4 = (uint)(byte)buf[3];
                                  local_38 = buf + 4;
                                  break;
                                case 2:
                                  uVar4 = (uint)(byte)buf[5] | CONCAT11(buf[4],buf[3]) & 0xff00 |
                                          (CONCAT11(buf[4],buf[3]) & 0xff) << 0x10;
                                  local_38 = buf + 6;
                                  break;
                                default:
                                  goto switchD_0012205d_caseD_ca;
                                case 0xd:
                                case 0xe:
                                case 0xf:
                                case 0x10:
                                case 0x11:
                                  uVar4 = 0x10;
                                  local_38 = buf + 2;
                                }
                                cVar1 = *local_38;
                                _ok((uint)(uVar4 == 0x10),"0x10 == len2",
                                    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                                    ,0x261,"len(mp_decode_ext(x, %u))",0x10);
                                _ok((uint)(cVar1 == '\0'),"ext_type == 0",
                                    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                                    ,0x261,"type(mp_decode_ext(x))");
                                if ((byte)buf[1] - 199 < 0x12) {
                                  local_40 = (char *)CONCAT71(local_40._1_7_,0xd8);
                                  switch((uint)(byte)buf[1]) {
                                  case 199:
                                    uVar4 = (uint)(byte)buf[2];
                                    pcVar9 = buf + 3;
                                    break;
                                  case 200:
                                    uVar4 = (uint)(ushort)(CONCAT11(buf[3],buf[2]) << 8 |
                                                          (ushort)(byte)buf[3]);
                                    pcVar9 = buf + 4;
                                    break;
                                  case 0xc9:
                                    uVar2 = CONCAT12(buf[4],CONCAT11(buf[3],buf[2]));
                                    uVar4 = (uint)(byte)buf[5] | (uVar2 & 0xff0000) >> 8 |
                                            (uVar2 & 0xff00) << 8 | CONCAT13(buf[5],uVar2) << 0x18;
                                    pcVar9 = buf + 6;
                                    break;
                                  default:
                                    goto switchD_0012205d_caseD_ca;
                                  case 0xd4:
                                  case 0xd5:
                                  case 0xd6:
                                  case 0xd7:
                                  case 0xd8:
                                    uVar4 = 1 << (buf[1] + 0x2cU & 0x1f);
                                    pcVar9 = buf + 2;
                                  }
                                  _ok((uint)(uVar4 == 0x10),"0x10 == len2",
                                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                                      ,0x261,"len(mp_decode_strbin(x, %u))",0x10);
                                  local_50 = (byte *)(buf + 1);
                                  lVar8 = 1;
                                  do {
                                    lVar6 = (long)""[*local_50];
                                    if (lVar6 < 0) {
                                      if (*local_50 == 0xd9) {
                                        local_50 = local_50 + (ulong)local_50[1] + 2;
                                        goto LAB_001255bf;
                                      }
                                      if (-0x20 < ""[*local_50]) {
                                        lVar8 = lVar8 - lVar6;
                                        local_50 = local_50 + 1;
                                        goto LAB_001255bf;
                                      }
                                      mp_next_slowpath((char **)&local_50,lVar8);
                                      bVar3 = false;
                                      lVar6 = lVar8;
                                    }
                                    else {
                                      local_50 = local_50 + 1 + lVar6;
LAB_001255bf:
                                      bVar3 = true;
                                      lVar6 = lVar8;
                                    }
                                  } while ((bVar3) && (lVar8 = lVar6 + -1, 1 < lVar6));
                                  local_48 = buf + 1;
                                  iVar5 = mp_check(&local_48,(char *)(local_50 + 0x10));
                                  lVar8 = 0;
                                  _ok((uint)(iVar5 == 0),"!mp_check(&d4, d3 + 0x10)",
                                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                                      ,0x261,"mp_check_ext(mp_encode_ext(x, 0x10))");
                                  _ok((uint)(pcVar9 + uVar4 == buf + 0x12),"d1 == d2",
                                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                                      ,0x261,"len(mp_decode_ext(x, 0x10)");
                                  _ok((uint)(local_50 == (byte *)(buf + 0x13)),"d1 == d3",
                                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                                      ,0x261,"len(mp_next_ext(x, 0x10)");
                                  _ok((uint)(local_48 == buf + 0x13),"d1 == d4",
                                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                                      ,0x261,"len(mp_check_ext(x, 0x10)");
                                  _ok((uint)((char)local_40 != '\0'),
                                      "mp_sizeof_ext(0x10) == (uint32_t) (d1 - data)",
                                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                                      ,0x261,"mp_sizeof_ext(0x10)");
                                  auVar10[0] = -(local_38[1] == str[0]);
                                  auVar10[1] = -(local_38[2] == str[1]);
                                  auVar10[2] = -(local_38[3] == str[2]);
                                  auVar10[3] = -(local_38[4] == str[3]);
                                  auVar10[4] = -(local_38[5] == str[4]);
                                  auVar10[5] = -(local_38[6] == str[5]);
                                  auVar10[6] = -(local_38[7] == str[6]);
                                  auVar10[7] = -(local_38[8] == str[7]);
                                  auVar10[8] = -(local_38[9] == str[8]);
                                  auVar10[9] = -(local_38[10] == str[9]);
                                  auVar10[10] = -(local_38[0xb] == str[10]);
                                  auVar10[0xb] = -(local_38[0xc] == str[0xb]);
                                  auVar10[0xc] = -(local_38[0xd] == str[0xc]);
                                  auVar10[0xd] = -(local_38[0xe] == str[0xd]);
                                  auVar10[0xe] = -(local_38[0xf] == str[0xe]);
                                  auVar10[0xf] = -(local_38[0x10] == str[0xf]);
                                  _ok((uint)((ushort)((ushort)(SUB161(auVar10 >> 7,0) & 1) |
                                                      (ushort)(SUB161(auVar10 >> 0xf,0) & 1) << 1 |
                                                      (ushort)(SUB161(auVar10 >> 0x17,0) & 1) << 2 |
                                                      (ushort)(SUB161(auVar10 >> 0x1f,0) & 1) << 3 |
                                                      (ushort)(SUB161(auVar10 >> 0x27,0) & 1) << 4 |
                                                      (ushort)(SUB161(auVar10 >> 0x2f,0) & 1) << 5 |
                                                      (ushort)(SUB161(auVar10 >> 0x37,0) & 1) << 6 |
                                                      (ushort)(SUB161(auVar10 >> 0x3f,0) & 1) << 7 |
                                                      (ushort)(SUB161(auVar10 >> 0x47,0) & 1) << 8 |
                                                      (ushort)(SUB161(auVar10 >> 0x4f,0) & 1) << 9 |
                                                      (ushort)(SUB161(auVar10 >> 0x57,0) & 1) << 10
                                                      | (ushort)(SUB161(auVar10 >> 0x5f,0) & 1) <<
                                                        0xb | (ushort)(SUB161(auVar10 >> 0x67,0) & 1
                                                                      ) << 0xc |
                                                      (ushort)(SUB161(auVar10 >> 0x6f,0) & 1) << 0xd
                                                      | (ushort)(SUB161(auVar10 >> 0x77,0) & 1) <<
                                                        0xe | (ushort)(auVar10[0xf] >> 7) << 0xf) ==
                                            0xffff),"memcmp(s1, s2, 0x10) == 0",
                                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                                      ,0x261,"mp_encode_ext(x, 0x10) == x");
                                  _space((FILE *)_stdout);
                                  fwrite("# ",2,1,_stdout);
                                  fwrite("ext len=0x11",0xc,1,_stdout);
                                  fputc(10,_stdout);
                                  do {
                                    str[lVar8] = (char)lVar8 + 'a';
                                    lVar8 = lVar8 + 1;
                                  } while (lVar8 != 0x11);
                                  buf[1] = -0x39;
                                  buf[2] = '\x11';
                                  buf[3] = '\0';
                                  buf[0xd] = str[9];
                                  buf[0xc] = str[8];
                                  buf[0xe] = str[10];
                                  buf[0xf] = str[0xb];
                                  buf[0x10] = str[0xc];
                                  buf[0x11] = str[0xd];
                                  buf[0x12] = str[0xe];
                                  buf[0x13] = str[0xf];
                                  buf[4] = str[0];
                                  buf[5] = str[1];
                                  buf[6] = str[2];
                                  buf[7] = str[3];
                                  buf[8] = str[4];
                                  buf[9] = str[5];
                                  buf[10] = str[6];
                                  buf[0xb] = str[7];
                                  buf[0x14] = str[0x10];
                                  _ok(1,"0x11 == len2",
                                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                                      ,0x263,"len(mp_decode_ext(x, %u))",0x11);
                                  _ok(1,"ext_type == 0",
                                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                                      ,0x263,"type(mp_decode_ext(x))");
                                  switch(buf[1]) {
                                  case -0x39:
                                    uVar4 = (uint)(byte)buf[2];
                                    pcVar9 = buf + 3;
                                    break;
                                  case -0x38:
                                    uVar4 = (uint)(ushort)(CONCAT11(buf[3],buf[2]) << 8 |
                                                          (ushort)(byte)buf[3]);
                                    pcVar9 = buf + 4;
                                    break;
                                  case -0x37:
                                    uVar2 = CONCAT12(buf[4],CONCAT11(buf[3],buf[2]));
                                    uVar4 = (uint)(byte)buf[5] | (uVar2 & 0xff0000) >> 8 |
                                            (uVar2 & 0xff00) << 8 | CONCAT13(buf[5],uVar2) << 0x18;
                                    pcVar9 = buf + 6;
                                    break;
                                  default:
                                    goto switchD_0012205d_caseD_ca;
                                  case -0x2c:
                                  case -0x2b:
                                  case -0x2a:
                                  case -0x29:
                                  case -0x28:
                                    uVar4 = 1 << (buf[1] + 0x2cU & 0x1f);
                                    pcVar9 = buf + 2;
                                  }
                                  _ok((uint)(uVar4 == 0x11),"0x11 == len2",
                                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                                      ,0x263,"len(mp_decode_strbin(x, %u))",0x11);
                                  local_50 = (byte *)(buf + 1);
                                  lVar8 = 1;
                                  do {
                                    lVar6 = (long)""[*local_50];
                                    if (lVar6 < 0) {
                                      if (*local_50 == 0xd9) {
                                        local_50 = local_50 + (ulong)local_50[1] + 2;
                                        goto LAB_001258cf;
                                      }
                                      if (-0x20 < ""[*local_50]) {
                                        lVar8 = lVar8 - lVar6;
                                        local_50 = local_50 + 1;
                                        goto LAB_001258cf;
                                      }
                                      mp_next_slowpath((char **)&local_50,lVar8);
                                      bVar3 = false;
                                      lVar6 = lVar8;
                                    }
                                    else {
                                      local_50 = local_50 + 1 + lVar6;
LAB_001258cf:
                                      bVar3 = true;
                                      lVar6 = lVar8;
                                    }
                                  } while ((bVar3) && (lVar8 = lVar6 + -1, 1 < lVar6));
                                  local_48 = buf + 1;
                                  iVar5 = mp_check(&local_48,(char *)(local_50 + 0x11));
                                  uVar7 = 0;
                                  _ok((uint)(iVar5 == 0),"!mp_check(&d4, d3 + 0x11)",
                                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                                      ,0x263,"mp_check_ext(mp_encode_ext(x, 0x11))");
                                  _ok((uint)(pcVar9 + uVar4 == buf + 0x14),"d1 == d2",
                                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                                      ,0x263,"len(mp_decode_ext(x, 0x11)");
                                  _ok((uint)(local_50 == (byte *)(buf + 0x15)),"d1 == d3",
                                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                                      ,0x263,"len(mp_next_ext(x, 0x11)");
                                  _ok((uint)(local_48 == buf + 0x15),"d1 == d4",
                                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                                      ,0x263,"len(mp_check_ext(x, 0x11)");
                                  _ok(1,"mp_sizeof_ext(0x11) == (uint32_t) (d1 - data)",
                                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                                      ,0x263,"mp_sizeof_ext(0x11)");
                                  auVar12[0] = -(buf[0x14] == str[0x10]);
                                  auVar12[1] = 0xff;
                                  auVar12[2] = 0xff;
                                  auVar12[3] = 0xff;
                                  auVar12[4] = 0xff;
                                  auVar12[5] = 0xff;
                                  auVar12[6] = 0xff;
                                  auVar12[7] = 0xff;
                                  auVar12[8] = 0xff;
                                  auVar12[9] = 0xff;
                                  auVar12[10] = 0xff;
                                  auVar12[0xb] = 0xff;
                                  auVar12[0xc] = 0xff;
                                  auVar12[0xd] = 0xff;
                                  auVar12[0xe] = 0xff;
                                  auVar12[0xf] = 0xff;
                                  auVar11[0] = -(buf[4] == str[0]);
                                  auVar11[1] = -(buf[5] == str[1]);
                                  auVar11[2] = -(buf[6] == str[2]);
                                  auVar11[3] = -(buf[7] == str[3]);
                                  auVar11[4] = -(buf[8] == str[4]);
                                  auVar11[5] = -(buf[9] == str[5]);
                                  auVar11[6] = -(buf[10] == str[6]);
                                  auVar11[7] = -(buf[0xb] == str[7]);
                                  auVar11[8] = -(buf[0xc] == str[8]);
                                  auVar11[9] = -(buf[0xd] == str[9]);
                                  auVar11[10] = -(buf[0xe] == str[10]);
                                  auVar11[0xb] = -(buf[0xf] == str[0xb]);
                                  auVar11[0xc] = -(buf[0x10] == str[0xc]);
                                  auVar11[0xd] = -(buf[0x11] == str[0xd]);
                                  auVar11[0xe] = -(buf[0x12] == str[0xe]);
                                  auVar11[0xf] = -(buf[0x13] == str[0xf]);
                                  auVar11 = auVar11 & auVar12;
                                  _ok((uint)((ushort)((ushort)(SUB161(auVar11 >> 7,0) & 1) |
                                                      (ushort)(SUB161(auVar11 >> 0xf,0) & 1) << 1 |
                                                      (ushort)(SUB161(auVar11 >> 0x17,0) & 1) << 2 |
                                                      (ushort)(SUB161(auVar11 >> 0x1f,0) & 1) << 3 |
                                                      (ushort)(SUB161(auVar11 >> 0x27,0) & 1) << 4 |
                                                      (ushort)(SUB161(auVar11 >> 0x2f,0) & 1) << 5 |
                                                      (ushort)(SUB161(auVar11 >> 0x37,0) & 1) << 6 |
                                                      (ushort)(SUB161(auVar11 >> 0x3f,0) & 1) << 7 |
                                                      (ushort)(SUB161(auVar11 >> 0x47,0) & 1) << 8 |
                                                      (ushort)(SUB161(auVar11 >> 0x4f,0) & 1) << 9 |
                                                      (ushort)(SUB161(auVar11 >> 0x57,0) & 1) << 10
                                                      | (ushort)(SUB161(auVar11 >> 0x5f,0) & 1) <<
                                                        0xb | (ushort)(SUB161(auVar11 >> 0x67,0) & 1
                                                                      ) << 0xc |
                                                      (ushort)(SUB161(auVar11 >> 0x6f,0) & 1) << 0xd
                                                      | (ushort)(SUB161(auVar11 >> 0x77,0) & 1) <<
                                                        0xe | (ushort)(byte)(auVar11[0xf] >> 7) <<
                                                              0xf) == 0xffff),
                                      "memcmp(s1, s2, 0x11) == 0",
                                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                                      ,0x263,"mp_encode_ext(x, 0x11) == x");
                                  _space((FILE *)_stdout);
                                  fwrite("# ",2,1,_stdout);
                                  fwrite("ext len=0xfe",0xc,1,_stdout);
                                  fputc(10,_stdout);
                                  do {
                                    str[uVar7] = ((char)((uVar7 & 0xffffffff) / 0x1a) * -0x19 -
                                                 (char)((uVar7 & 0xffffffff) / 0x1a)) + (char)uVar7
                                                 + 'a';
                                    uVar7 = uVar7 + 1;
                                  } while (uVar7 != 0xfe);
                                  buf[1] = -0x39;
                                  buf[2] = -2;
                                  buf[3] = '\0';
                                  pcVar9 = buf + 4;
                                  memcpy(buf + 4,str,0xfe);
                                  _ok(1,"0xfe == len2",
                                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                                      ,0x264,"len(mp_decode_ext(x, %u))",0xfe);
                                  _ok(1,"ext_type == 0",
                                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                                      ,0x264,"type(mp_decode_ext(x))");
                                  switch(buf[1]) {
                                  case -0x39:
                                    uVar4 = (uint)(byte)buf[2];
                                    pcVar9 = buf + 3;
                                    break;
                                  case -0x38:
                                    uVar4 = (uint)(ushort)(CONCAT11(buf[3],buf[2]) << 8 |
                                                          (ushort)(byte)buf[3]);
                                    break;
                                  case -0x37:
                                    uVar2 = CONCAT12(buf[4],CONCAT11(buf[3],buf[2]));
                                    uVar4 = (uint)(byte)buf[5] | (uVar2 & 0xff0000) >> 8 |
                                            (uVar2 & 0xff00) << 8 | CONCAT13(buf[5],uVar2) << 0x18;
                                    pcVar9 = buf + 6;
                                    break;
                                  default:
                                    goto switchD_0012205d_caseD_ca;
                                  case -0x2c:
                                  case -0x2b:
                                  case -0x2a:
                                  case -0x29:
                                  case -0x28:
                                    uVar4 = 1 << (buf[1] + 0x2cU & 0x1f);
                                    pcVar9 = buf + 2;
                                  }
                                  _ok((uint)(uVar4 == 0xfe),"0xfe == len2",
                                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                                      ,0x264,"len(mp_decode_strbin(x, %u))",0xfe);
                                  local_50 = (byte *)(buf + 1);
                                  lVar8 = 1;
                                  do {
                                    lVar6 = (long)""[*local_50];
                                    if (lVar6 < 0) {
                                      if (*local_50 == 0xd9) {
                                        local_50 = local_50 + (ulong)local_50[1] + 2;
                                        goto LAB_00125c0a;
                                      }
                                      if (-0x20 < ""[*local_50]) {
                                        lVar8 = lVar8 - lVar6;
                                        local_50 = local_50 + 1;
                                        goto LAB_00125c0a;
                                      }
                                      mp_next_slowpath((char **)&local_50,lVar8);
                                      bVar3 = false;
                                      lVar6 = lVar8;
                                    }
                                    else {
                                      local_50 = local_50 + 1 + lVar6;
LAB_00125c0a:
                                      bVar3 = true;
                                      lVar6 = lVar8;
                                    }
                                  } while ((bVar3) && (lVar8 = lVar6 + -1, 1 < lVar6));
                                  local_48 = buf + 1;
                                  iVar5 = mp_check(&local_48,(char *)(local_50 + 0xfe));
                                  uVar7 = 0;
                                  _ok((uint)(iVar5 == 0),"!mp_check(&d4, d3 + 0xfe)",
                                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                                      ,0x264,"mp_check_ext(mp_encode_ext(x, 0xfe))");
                                  _ok((uint)(pcVar9 + uVar4 == buf + 0x101),"d1 == d2",
                                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                                      ,0x264,"len(mp_decode_ext(x, 0xfe)");
                                  _ok((uint)(local_50 == (byte *)(buf + 0x102)),"d1 == d3",
                                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                                      ,0x264,"len(mp_next_ext(x, 0xfe)");
                                  _ok((uint)(local_48 == buf + 0x102),"d1 == d4",
                                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                                      ,0x264,"len(mp_check_ext(x, 0xfe)");
                                  _ok(1,"mp_sizeof_ext(0xfe) == (uint32_t) (d1 - data)",
                                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                                      ,0x264,"mp_sizeof_ext(0xfe)");
                                  iVar5 = bcmp(str,buf + 4,0xfe);
                                  _ok((uint)(iVar5 == 0),"memcmp(s1, s2, 0xfe) == 0",
                                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                                      ,0x264,"mp_encode_ext(x, 0xfe) == x");
                                  _space((FILE *)_stdout);
                                  fwrite("# ",2,1,_stdout);
                                  fwrite("ext len=0xff",0xc,1,_stdout);
                                  fputc(10,_stdout);
                                  do {
                                    str[uVar7] = ((char)((uVar7 & 0xffffffff) / 0x1a) * -0x19 -
                                                 (char)((uVar7 & 0xffffffff) / 0x1a)) + (char)uVar7
                                                 + 'a';
                                    uVar7 = uVar7 + 1;
                                  } while (uVar7 != 0xff);
                                  buf[1] = -0x39;
                                  buf[2] = -1;
                                  buf[3] = '\0';
                                  pcVar9 = buf + 4;
                                  memcpy(buf + 4,str,0xff);
                                  _ok(1,"0xff == len2",
                                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                                      ,0x265,"len(mp_decode_ext(x, %u))",0xff);
                                  _ok(1,"ext_type == 0",
                                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                                      ,0x265,"type(mp_decode_ext(x))");
                                  switch(buf[1]) {
                                  case -0x39:
                                    uVar4 = (uint)(byte)buf[2];
                                    pcVar9 = buf + 3;
                                    break;
                                  case -0x38:
                                    uVar4 = (uint)(ushort)(CONCAT11(buf[3],buf[2]) << 8 |
                                                          (ushort)(byte)buf[3]);
                                    break;
                                  case -0x37:
                                    uVar2 = CONCAT12(buf[4],CONCAT11(buf[3],buf[2]));
                                    uVar4 = (uint)(byte)buf[5] | (uVar2 & 0xff0000) >> 8 |
                                            (uVar2 & 0xff00) << 8 | CONCAT13(buf[5],uVar2) << 0x18;
                                    pcVar9 = buf + 6;
                                    break;
                                  default:
                                    goto switchD_0012205d_caseD_ca;
                                  case -0x2c:
                                  case -0x2b:
                                  case -0x2a:
                                  case -0x29:
                                  case -0x28:
                                    uVar4 = 1 << (buf[1] + 0x2cU & 0x1f);
                                    pcVar9 = buf + 2;
                                  }
                                  _ok((uint)(uVar4 == 0xff),"0xff == len2",
                                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                                      ,0x265,"len(mp_decode_strbin(x, %u))",0xff);
                                  local_50 = (byte *)(buf + 1);
                                  lVar8 = 1;
                                  do {
                                    lVar6 = (long)""[*local_50];
                                    if (lVar6 < 0) {
                                      if (*local_50 == 0xd9) {
                                        local_50 = local_50 + (ulong)local_50[1] + 2;
                                        goto LAB_00125f29;
                                      }
                                      if (-0x20 < ""[*local_50]) {
                                        lVar8 = lVar8 - lVar6;
                                        local_50 = local_50 + 1;
                                        goto LAB_00125f29;
                                      }
                                      mp_next_slowpath((char **)&local_50,lVar8);
                                      bVar3 = false;
                                      lVar6 = lVar8;
                                    }
                                    else {
                                      local_50 = local_50 + 1 + lVar6;
LAB_00125f29:
                                      bVar3 = true;
                                      lVar6 = lVar8;
                                    }
                                  } while ((bVar3) && (lVar8 = lVar6 + -1, 1 < lVar6));
                                  local_48 = buf + 1;
                                  iVar5 = mp_check(&local_48,(char *)(local_50 + 0xff));
                                  uVar7 = 0;
                                  _ok((uint)(iVar5 == 0),"!mp_check(&d4, d3 + 0xff)",
                                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                                      ,0x265,"mp_check_ext(mp_encode_ext(x, 0xff))");
                                  _ok((uint)(pcVar9 + uVar4 == buf + 0x102),"d1 == d2",
                                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                                      ,0x265,"len(mp_decode_ext(x, 0xff)");
                                  _ok((uint)(local_50 == (byte *)(buf + 0x103)),"d1 == d3",
                                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                                      ,0x265,"len(mp_next_ext(x, 0xff)");
                                  _ok((uint)(local_48 == buf + 0x103),"d1 == d4",
                                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                                      ,0x265,"len(mp_check_ext(x, 0xff)");
                                  _ok(1,"mp_sizeof_ext(0xff) == (uint32_t) (d1 - data)",
                                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                                      ,0x265,"mp_sizeof_ext(0xff)");
                                  pcVar9 = buf + 4;
                                  iVar5 = bcmp(str,buf + 4,0xff);
                                  _ok((uint)(iVar5 == 0),"memcmp(s1, s2, 0xff) == 0",
                                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                                      ,0x265,"mp_encode_ext(x, 0xff) == x");
                                  _space((FILE *)_stdout);
                                  fwrite("# ",2,1,_stdout);
                                  fwrite("ext len=0x0100",0xe,1,_stdout);
                                  fputc(10,_stdout);
                                  do {
                                    str[uVar7] = ((char)((uVar7 & 0xffffffff) / 0x1a) * -0x19 -
                                                 (char)((uVar7 & 0xffffffff) / 0x1a)) + (char)uVar7
                                                 + 'a';
                                    uVar7 = uVar7 + 1;
                                  } while (uVar7 != 0x100);
                                  buf[1] = -0x38;
                                  buf[2] = '\x01';
                                  buf[3] = '\0';
                                  buf[4] = '\0';
                                  memcpy(buf + 5,str,0x100);
                                  _ok(1,"0x0100 == len2",
                                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                                      ,0x267,"len(mp_decode_ext(x, %u))",0x100);
                                  _ok(1,"ext_type == 0",
                                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                                      ,0x267,"type(mp_decode_ext(x))");
                                  switch(buf[1]) {
                                  case -0x39:
                                    uVar4 = (uint)(byte)buf[2];
                                    pcVar9 = buf + 3;
                                    break;
                                  case -0x38:
                                    uVar4 = (uint)(ushort)(CONCAT11(buf[3],buf[2]) << 8 |
                                                          (ushort)(byte)buf[3]);
                                    break;
                                  case -0x37:
                                    uVar2 = CONCAT12(buf[4],CONCAT11(buf[3],buf[2]));
                                    uVar4 = (uint)(byte)buf[5] | (uVar2 & 0xff0000) >> 8 |
                                            (uVar2 & 0xff00) << 8 | CONCAT13(buf[5],uVar2) << 0x18;
                                    pcVar9 = buf + 6;
                                    break;
                                  default:
                                    goto switchD_0012205d_caseD_ca;
                                  case -0x2c:
                                  case -0x2b:
                                  case -0x2a:
                                  case -0x29:
                                  case -0x28:
                                    uVar4 = 1 << (buf[1] + 0x2cU & 0x1f);
                                    pcVar9 = buf + 2;
                                  }
                                  _ok((uint)(uVar4 == 0x100),"0x0100 == len2",
                                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                                      ,0x267,"len(mp_decode_strbin(x, %u))",0x100);
                                  local_50 = (byte *)(buf + 1);
                                  lVar8 = 1;
                                  do {
                                    lVar6 = (long)""[*local_50];
                                    if (lVar6 < 0) {
                                      if (*local_50 == 0xd9) {
                                        local_50 = local_50 + (ulong)local_50[1] + 2;
                                        goto LAB_0012624f;
                                      }
                                      if (-0x20 < ""[*local_50]) {
                                        lVar8 = lVar8 - lVar6;
                                        local_50 = local_50 + 1;
                                        goto LAB_0012624f;
                                      }
                                      mp_next_slowpath((char **)&local_50,lVar8);
                                      bVar3 = false;
                                      lVar6 = lVar8;
                                    }
                                    else {
                                      local_50 = local_50 + 1 + lVar6;
LAB_0012624f:
                                      bVar3 = true;
                                      lVar6 = lVar8;
                                    }
                                  } while ((bVar3) && (lVar8 = lVar6 + -1, 1 < lVar6));
                                  local_48 = buf + 1;
                                  iVar5 = mp_check(&local_48,(char *)(local_50 + 0x100));
                                  uVar7 = 0;
                                  _ok((uint)(iVar5 == 0),"!mp_check(&d4, d3 + 0x0100)",
                                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                                      ,0x267,"mp_check_ext(mp_encode_ext(x, 0x0100))");
                                  _ok((uint)(pcVar9 + uVar4 == buf + 0x104),"d1 == d2",
                                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                                      ,0x267,"len(mp_decode_ext(x, 0x0100)");
                                  _ok((uint)(local_50 == (byte *)(buf + 0x105)),"d1 == d3",
                                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                                      ,0x267,"len(mp_next_ext(x, 0x0100)");
                                  _ok((uint)(local_48 == buf + 0x105),"d1 == d4",
                                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                                      ,0x267,"len(mp_check_ext(x, 0x0100)");
                                  _ok(1,"mp_sizeof_ext(0x0100) == (uint32_t) (d1 - data)",
                                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                                      ,0x267,"mp_sizeof_ext(0x0100)");
                                  iVar5 = bcmp(str,buf + 5,0x100);
                                  _ok((uint)(iVar5 == 0),"memcmp(s1, s2, 0x0100) == 0",
                                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                                      ,0x267,"mp_encode_ext(x, 0x0100) == x");
                                  _space((FILE *)_stdout);
                                  fwrite("# ",2,1,_stdout);
                                  fwrite("ext len=0x0101",0xe,1,_stdout);
                                  fputc(10,_stdout);
                                  do {
                                    str[uVar7] = ((char)((uVar7 & 0xffffffff) / 0x1a) * -0x19 -
                                                 (char)((uVar7 & 0xffffffff) / 0x1a)) + (char)uVar7
                                                 + 'a';
                                    uVar7 = uVar7 + 1;
                                  } while (uVar7 != 0x101);
                                  buf[1] = -0x38;
                                  buf[2] = '\x01';
                                  buf[3] = '\x01';
                                  buf[4] = '\0';
                                  memcpy(buf + 5,str,0x101);
                                  _ok(1,"0x0101 == len2",
                                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                                      ,0x268,"len(mp_decode_ext(x, %u))",0x101);
                                  _ok(1,"ext_type == 0",
                                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                                      ,0x268,"type(mp_decode_ext(x))");
                                  switch(buf[1]) {
                                  case -0x39:
                                    uVar4 = (uint)(byte)buf[2];
                                    pcVar9 = buf + 3;
                                    break;
                                  case -0x38:
                                    uVar4 = (uint)(ushort)(CONCAT11(buf[3],buf[2]) << 8 |
                                                          (ushort)(byte)buf[3]);
                                    pcVar9 = buf + 4;
                                    break;
                                  case -0x37:
                                    uVar2 = CONCAT12(buf[4],CONCAT11(buf[3],buf[2]));
                                    uVar4 = (uint)(byte)buf[5] | (uVar2 & 0xff0000) >> 8 |
                                            (uVar2 & 0xff00) << 8 | CONCAT13(buf[5],uVar2) << 0x18;
                                    pcVar9 = buf + 6;
                                    break;
                                  default:
                                    goto switchD_0012205d_caseD_ca;
                                  case -0x2c:
                                  case -0x2b:
                                  case -0x2a:
                                  case -0x29:
                                  case -0x28:
                                    uVar4 = 1 << (buf[1] + 0x2cU & 0x1f);
                                    pcVar9 = buf + 2;
                                  }
                                  _ok((uint)(uVar4 == 0x101),"0x0101 == len2",
                                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                                      ,0x268,"len(mp_decode_strbin(x, %u))",0x101);
                                  local_50 = (byte *)(buf + 1);
                                  lVar8 = 1;
                                  do {
                                    lVar6 = (long)""[*local_50];
                                    if (lVar6 < 0) {
                                      if (*local_50 == 0xd9) {
                                        local_50 = local_50 + (ulong)local_50[1] + 2;
                                        goto LAB_00126572;
                                      }
                                      if (-0x20 < ""[*local_50]) {
                                        lVar8 = lVar8 - lVar6;
                                        local_50 = local_50 + 1;
                                        goto LAB_00126572;
                                      }
                                      mp_next_slowpath((char **)&local_50,lVar8);
                                      bVar3 = false;
                                      lVar6 = lVar8;
                                    }
                                    else {
                                      local_50 = local_50 + 1 + lVar6;
LAB_00126572:
                                      bVar3 = true;
                                      lVar6 = lVar8;
                                    }
                                  } while ((bVar3) && (lVar8 = lVar6 + -1, 1 < lVar6));
                                  local_48 = buf + 1;
                                  iVar5 = mp_check(&local_48,(char *)(local_50 + 0x101));
                                  uVar7 = 0;
                                  _ok((uint)(iVar5 == 0),"!mp_check(&d4, d3 + 0x0101)",
                                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                                      ,0x268,"mp_check_ext(mp_encode_ext(x, 0x0101))");
                                  _ok((uint)(pcVar9 + uVar4 == buf + 0x105),"d1 == d2",
                                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                                      ,0x268,"len(mp_decode_ext(x, 0x0101)");
                                  _ok((uint)(local_50 == (byte *)(buf + 0x106)),"d1 == d3",
                                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                                      ,0x268,"len(mp_next_ext(x, 0x0101)");
                                  _ok((uint)(local_48 == buf + 0x106),"d1 == d4",
                                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                                      ,0x268,"len(mp_check_ext(x, 0x0101)");
                                  _ok(1,"mp_sizeof_ext(0x0101) == (uint32_t) (d1 - data)",
                                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                                      ,0x268,"mp_sizeof_ext(0x0101)");
                                  iVar5 = bcmp(str,buf + 5,0x101);
                                  _ok((uint)(iVar5 == 0),"memcmp(s1, s2, 0x0101) == 0",
                                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                                      ,0x268,"mp_encode_ext(x, 0x0101) == x");
                                  _space((FILE *)_stdout);
                                  fwrite("# ",2,1,_stdout);
                                  fwrite("ext len=0xfffe",0xe,1,_stdout);
                                  fputc(10,_stdout);
                                  do {
                                    str[uVar7] = ((char)((uVar7 & 0xffffffff) / 0x1a) * -0x19 -
                                                 (char)((uVar7 & 0xffffffff) / 0x1a)) + (char)uVar7
                                                 + 'a';
                                    uVar7 = uVar7 + 1;
                                  } while (uVar7 != 0xfffe);
                                  buf[1] = -0x38;
                                  buf[2] = -1;
                                  buf[3] = -2;
                                  buf[4] = '\0';
                                  memcpy(buf + 5,str,0xfffe);
                                  _ok(1,"0xfffe == len2",
                                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                                      ,0x269,"len(mp_decode_ext(x, %u))",0xfffe);
                                  _ok(1,"ext_type == 0",
                                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                                      ,0x269,"type(mp_decode_ext(x))");
                                  switch(buf[1]) {
                                  case -0x39:
                                    uVar4 = (uint)(byte)buf[2];
                                    pcVar9 = buf + 3;
                                    break;
                                  case -0x38:
                                    uVar4 = (uint)(ushort)(CONCAT11(buf[3],buf[2]) << 8 |
                                                          (ushort)(byte)buf[3]);
                                    pcVar9 = buf + 4;
                                    break;
                                  case -0x37:
                                    uVar2 = CONCAT12(buf[4],CONCAT11(buf[3],buf[2]));
                                    uVar4 = (uint)(byte)buf[5] | (uVar2 & 0xff0000) >> 8 |
                                            (uVar2 & 0xff00) << 8 | CONCAT13(buf[5],uVar2) << 0x18;
                                    pcVar9 = buf + 6;
                                    break;
                                  default:
                                    goto switchD_0012205d_caseD_ca;
                                  case -0x2c:
                                  case -0x2b:
                                  case -0x2a:
                                  case -0x29:
                                  case -0x28:
                                    uVar4 = 1 << (buf[1] + 0x2cU & 0x1f);
                                    pcVar9 = buf + 2;
                                  }
                                  _ok((uint)(uVar4 == 0xfffe),"0xfffe == len2",
                                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                                      ,0x269,"len(mp_decode_strbin(x, %u))",0xfffe);
                                  local_50 = (byte *)(buf + 1);
                                  lVar8 = 1;
                                  do {
                                    lVar6 = (long)""[*local_50];
                                    if (lVar6 < 0) {
                                      if (*local_50 == 0xd9) {
                                        local_50 = local_50 + (ulong)local_50[1] + 2;
                                        goto LAB_00126894;
                                      }
                                      if (-0x20 < ""[*local_50]) {
                                        lVar8 = lVar8 - lVar6;
                                        local_50 = local_50 + 1;
                                        goto LAB_00126894;
                                      }
                                      mp_next_slowpath((char **)&local_50,lVar8);
                                      bVar3 = false;
                                      lVar6 = lVar8;
                                    }
                                    else {
                                      local_50 = local_50 + 1 + lVar6;
LAB_00126894:
                                      bVar3 = true;
                                      lVar6 = lVar8;
                                    }
                                  } while ((bVar3) && (lVar8 = lVar6 + -1, 1 < lVar6));
                                  local_48 = buf + 1;
                                  iVar5 = mp_check(&local_48,(char *)(local_50 + 0xfffe));
                                  uVar7 = 0;
                                  _ok((uint)(iVar5 == 0),"!mp_check(&d4, d3 + 0xfffe)",
                                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                                      ,0x269,"mp_check_ext(mp_encode_ext(x, 0xfffe))");
                                  _ok((uint)(pcVar9 + uVar4 == buf + 0x10002),"d1 == d2",
                                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                                      ,0x269,"len(mp_decode_ext(x, 0xfffe)");
                                  _ok((uint)(local_50 == (byte *)(buf + 0x10003)),"d1 == d3",
                                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                                      ,0x269,"len(mp_next_ext(x, 0xfffe)");
                                  _ok((uint)(local_48 == buf + 0x10003),"d1 == d4",
                                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                                      ,0x269,"len(mp_check_ext(x, 0xfffe)");
                                  _ok(1,"mp_sizeof_ext(0xfffe) == (uint32_t) (d1 - data)",
                                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                                      ,0x269,"mp_sizeof_ext(0xfffe)");
                                  iVar5 = bcmp(str,buf + 5,0xfffe);
                                  _ok((uint)(iVar5 == 0),"memcmp(s1, s2, 0xfffe) == 0",
                                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                                      ,0x269,"mp_encode_ext(x, 0xfffe) == x");
                                  _space((FILE *)_stdout);
                                  fwrite("# ",2,1,_stdout);
                                  fwrite("ext len=0xffff",0xe,1,_stdout);
                                  fputc(10,_stdout);
                                  do {
                                    str[uVar7] = ((char)((uVar7 & 0xffffffff) / 0x1a) * -0x19 -
                                                 (char)((uVar7 & 0xffffffff) / 0x1a)) + (char)uVar7
                                                 + 'a';
                                    uVar7 = uVar7 + 1;
                                  } while (uVar7 != 0xffff);
                                  buf[1] = -0x38;
                                  buf[2] = -1;
                                  buf[3] = -1;
                                  buf[4] = '\0';
                                  memcpy(buf + 5,str,0xffff);
                                  _ok(1,"0xffff == len2",
                                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                                      ,0x26a,"len(mp_decode_ext(x, %u))",0xffff);
                                  _ok(1,"ext_type == 0",
                                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                                      ,0x26a,"type(mp_decode_ext(x))");
                                  switch(buf[1]) {
                                  case -0x39:
                                    uVar4 = (uint)(byte)buf[2];
                                    pcVar9 = buf + 3;
                                    break;
                                  case -0x38:
                                    uVar4 = (uint)(ushort)(CONCAT11(buf[3],buf[2]) << 8 |
                                                          (ushort)(byte)buf[3]);
                                    pcVar9 = buf + 4;
                                    break;
                                  case -0x37:
                                    uVar2 = CONCAT12(buf[4],CONCAT11(buf[3],buf[2]));
                                    uVar4 = (uint)(byte)buf[5] | (uVar2 & 0xff0000) >> 8 |
                                            (uVar2 & 0xff00) << 8 | CONCAT13(buf[5],uVar2) << 0x18;
                                    pcVar9 = buf + 6;
                                    break;
                                  default:
                                    goto switchD_0012205d_caseD_ca;
                                  case -0x2c:
                                  case -0x2b:
                                  case -0x2a:
                                  case -0x29:
                                  case -0x28:
                                    uVar4 = 1 << (buf[1] + 0x2cU & 0x1f);
                                    pcVar9 = buf + 2;
                                  }
                                  _ok((uint)(uVar4 == 0xffff),"0xffff == len2",
                                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                                      ,0x26a,"len(mp_decode_strbin(x, %u))",0xffff);
                                  local_50 = (byte *)(buf + 1);
                                  lVar8 = 1;
                                  do {
                                    lVar6 = (long)""[*local_50];
                                    if (lVar6 < 0) {
                                      if (*local_50 == 0xd9) {
                                        local_50 = local_50 + (ulong)local_50[1] + 2;
                                        goto LAB_00126bb6;
                                      }
                                      if (-0x20 < ""[*local_50]) {
                                        lVar8 = lVar8 - lVar6;
                                        local_50 = local_50 + 1;
                                        goto LAB_00126bb6;
                                      }
                                      mp_next_slowpath((char **)&local_50,lVar8);
                                      bVar3 = false;
                                      lVar6 = lVar8;
                                    }
                                    else {
                                      local_50 = local_50 + 1 + lVar6;
LAB_00126bb6:
                                      bVar3 = true;
                                      lVar6 = lVar8;
                                    }
                                  } while ((bVar3) && (lVar8 = lVar6 + -1, 1 < lVar6));
                                  local_48 = buf + 1;
                                  iVar5 = mp_check(&local_48,(char *)(local_50 + 0xffff));
                                  uVar7 = 0;
                                  _ok((uint)(iVar5 == 0),"!mp_check(&d4, d3 + 0xffff)",
                                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                                      ,0x26a,"mp_check_ext(mp_encode_ext(x, 0xffff))");
                                  _ok((uint)(pcVar9 + uVar4 == buf + 0x10003),"d1 == d2",
                                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                                      ,0x26a,"len(mp_decode_ext(x, 0xffff)");
                                  _ok((uint)(local_50 == (byte *)(buf + 0x10004)),"d1 == d3",
                                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                                      ,0x26a,"len(mp_next_ext(x, 0xffff)");
                                  _ok((uint)(local_48 == buf + 0x10004),"d1 == d4",
                                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                                      ,0x26a,"len(mp_check_ext(x, 0xffff)");
                                  _ok(1,"mp_sizeof_ext(0xffff) == (uint32_t) (d1 - data)",
                                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                                      ,0x26a,"mp_sizeof_ext(0xffff)");
                                  iVar5 = bcmp(str,buf + 5,0xffff);
                                  _ok((uint)(iVar5 == 0),"memcmp(s1, s2, 0xffff) == 0",
                                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                                      ,0x26a,"mp_encode_ext(x, 0xffff) == x");
                                  _space((FILE *)_stdout);
                                  fwrite("# ",2,1,_stdout);
                                  fwrite("ext len=0x00010000",0x12,1,_stdout);
                                  fputc(10,_stdout);
                                  do {
                                    str[uVar7] = ((char)((uVar7 & 0xffffffff) / 0x1a) * -0x19 -
                                                 (char)((uVar7 & 0xffffffff) / 0x1a)) + (char)uVar7
                                                 + 'a';
                                    uVar7 = uVar7 + 1;
                                  } while (uVar7 != 0x10000);
                                  buf[1] = -0x37;
                                  buf[2] = '\0';
                                  buf[3] = '\x01';
                                  buf[4] = '\0';
                                  buf[5] = '\0';
                                  buf[6] = '\0';
                                  memcpy(buf + 7,str,0x10000);
                                  _ok(1,"0x00010000 == len2",
                                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                                      ,0x26c,"len(mp_decode_ext(x, %u))",0x10000);
                                  _ok(1,"ext_type == 0",
                                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                                      ,0x26c,"type(mp_decode_ext(x))");
                                  switch(buf[1]) {
                                  case -0x39:
                                    uVar4 = (uint)(byte)buf[2];
                                    pcVar9 = buf + 3;
                                    break;
                                  case -0x38:
                                    uVar4 = (uint)(ushort)(CONCAT11(buf[3],buf[2]) << 8 |
                                                          (ushort)(byte)buf[3]);
                                    pcVar9 = buf + 4;
                                    break;
                                  case -0x37:
                                    uVar2 = CONCAT12(buf[4],CONCAT11(buf[3],buf[2]));
                                    uVar4 = (uint)(byte)buf[5] | (uVar2 & 0xff0000) >> 8 |
                                            (uVar2 & 0xff00) << 8 | CONCAT13(buf[5],uVar2) << 0x18;
                                    pcVar9 = buf + 6;
                                    break;
                                  default:
                                    goto switchD_0012205d_caseD_ca;
                                  case -0x2c:
                                  case -0x2b:
                                  case -0x2a:
                                  case -0x29:
                                  case -0x28:
                                    uVar4 = 1 << (buf[1] + 0x2cU & 0x1f);
                                    pcVar9 = buf + 2;
                                  }
                                  _ok((uint)(uVar4 == 0x10000),"0x00010000 == len2",
                                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                                      ,0x26c,"len(mp_decode_strbin(x, %u))",0x10000);
                                  local_50 = (byte *)(buf + 1);
                                  lVar8 = 1;
                                  do {
                                    lVar6 = (long)""[*local_50];
                                    if (lVar6 < 0) {
                                      if (*local_50 == 0xd9) {
                                        local_50 = local_50 + (ulong)local_50[1] + 2;
                                        goto LAB_00126ed9;
                                      }
                                      if (-0x20 < ""[*local_50]) {
                                        lVar8 = lVar8 - lVar6;
                                        local_50 = local_50 + 1;
                                        goto LAB_00126ed9;
                                      }
                                      mp_next_slowpath((char **)&local_50,lVar8);
                                      bVar3 = false;
                                      lVar6 = lVar8;
                                    }
                                    else {
                                      local_50 = local_50 + 1 + lVar6;
LAB_00126ed9:
                                      bVar3 = true;
                                      lVar6 = lVar8;
                                    }
                                  } while ((bVar3) && (lVar8 = lVar6 + -1, 1 < lVar6));
                                  local_48 = buf + 1;
                                  iVar5 = mp_check(&local_48,(char *)(local_50 + 0x10000));
                                  uVar7 = 0;
                                  _ok((uint)(iVar5 == 0),"!mp_check(&d4, d3 + 0x00010000)",
                                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                                      ,0x26c,"mp_check_ext(mp_encode_ext(x, 0x00010000))");
                                  _ok((uint)(pcVar9 + uVar4 == buf + 0x10006),"d1 == d2",
                                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                                      ,0x26c,"len(mp_decode_ext(x, 0x00010000)");
                                  _ok((uint)(local_50 == (byte *)(buf + 0x10007)),"d1 == d3",
                                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                                      ,0x26c,"len(mp_next_ext(x, 0x00010000)");
                                  _ok((uint)(local_48 == buf + 0x10007),"d1 == d4",
                                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                                      ,0x26c,"len(mp_check_ext(x, 0x00010000)");
                                  _ok(1,"mp_sizeof_ext(0x00010000) == (uint32_t) (d1 - data)",
                                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                                      ,0x26c,"mp_sizeof_ext(0x00010000)");
                                  iVar5 = bcmp(str,buf + 7,0x10000);
                                  _ok((uint)(iVar5 == 0),"memcmp(s1, s2, 0x00010000) == 0",
                                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                                      ,0x26c,"mp_encode_ext(x, 0x00010000) == x");
                                  _space((FILE *)_stdout);
                                  fwrite("# ",2,1,_stdout);
                                  fwrite("ext len=0x00010001",0x12,1,_stdout);
                                  fputc(10,_stdout);
                                  do {
                                    str[uVar7] = ((char)((uVar7 & 0xffffffff) / 0x1a) * -0x19 -
                                                 (char)((uVar7 & 0xffffffff) / 0x1a)) + (char)uVar7
                                                 + 'a';
                                    uVar7 = uVar7 + 1;
                                  } while (uVar7 != 0x10001);
                                  buf[1] = -0x37;
                                  buf[2] = '\0';
                                  buf[3] = '\x01';
                                  buf[4] = '\0';
                                  buf[5] = '\x01';
                                  buf[6] = '\0';
                                  memcpy(buf + 7,str,0x10001);
                                  _ok(1,"0x00010001 == len2",
                                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                                      ,0x26d,"len(mp_decode_ext(x, %u))",0x10001);
                                  _ok(1,"ext_type == 0",
                                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                                      ,0x26d,"type(mp_decode_ext(x))");
                                  switch(buf[1]) {
                                  case -0x39:
                                    uVar4 = (uint)(byte)buf[2];
                                    pcVar9 = buf + 3;
                                    break;
                                  case -0x38:
                                    uVar4 = (uint)(ushort)(CONCAT11(buf[3],buf[2]) << 8 |
                                                          (ushort)(byte)buf[3]);
                                    pcVar9 = buf + 4;
                                    break;
                                  case -0x37:
                                    uVar2 = CONCAT12(buf[4],CONCAT11(buf[3],buf[2]));
                                    uVar4 = (uint)(byte)buf[5] | (uVar2 & 0xff0000) >> 8 |
                                            (uVar2 & 0xff00) << 8 | CONCAT13(buf[5],uVar2) << 0x18;
                                    pcVar9 = buf + 6;
                                    break;
                                  default:
                                    goto switchD_0012205d_caseD_ca;
                                  case -0x2c:
                                  case -0x2b:
                                  case -0x2a:
                                  case -0x29:
                                  case -0x28:
                                    uVar4 = 1 << (buf[1] + 0x2cU & 0x1f);
                                    pcVar9 = buf + 2;
                                  }
                                  _ok((uint)(uVar4 == 0x10001),"0x00010001 == len2",
                                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                                      ,0x26d,"len(mp_decode_strbin(x, %u))",0x10001);
                                  local_50 = (byte *)(buf + 1);
                                  lVar8 = 1;
                                  do {
                                    lVar6 = (long)""[*local_50];
                                    if (lVar6 < 0) {
                                      if (*local_50 == 0xd9) {
                                        local_50 = local_50 + (ulong)local_50[1] + 2;
                                        goto LAB_001271fc;
                                      }
                                      if (-0x20 < ""[*local_50]) {
                                        lVar8 = lVar8 - lVar6;
                                        local_50 = local_50 + 1;
                                        goto LAB_001271fc;
                                      }
                                      mp_next_slowpath((char **)&local_50,lVar8);
                                      bVar3 = false;
                                      lVar6 = lVar8;
                                    }
                                    else {
                                      local_50 = local_50 + 1 + lVar6;
LAB_001271fc:
                                      bVar3 = true;
                                      lVar6 = lVar8;
                                    }
                                    if ((!bVar3) || (lVar8 = lVar6 + -1, lVar6 < 2)) {
                                      local_48 = buf + 1;
                                      iVar5 = mp_check(&local_48,(char *)(local_50 + 0x10001));
                                      uVar7 = 0;
                                      _ok((uint)(iVar5 == 0),"!mp_check(&d4, d3 + 0x00010001)",
                                          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                                          ,0x26d,"mp_check_ext(mp_encode_ext(x, 0x00010001))");
                                      _ok((uint)(pcVar9 + uVar4 == buf + 0x10007),"d1 == d2",
                                          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                                          ,0x26d,"len(mp_decode_ext(x, 0x00010001)");
                                      _ok((uint)(local_50 == (byte *)(buf + 0x10008)),"d1 == d3",
                                          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                                          ,0x26d,"len(mp_next_ext(x, 0x00010001)");
                                      _ok((uint)(local_48 == buf + 0x10008),"d1 == d4",
                                          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                                          ,0x26d,"len(mp_check_ext(x, 0x00010001)");
                                      _ok(1,"mp_sizeof_ext(0x00010001) == (uint32_t) (d1 - data)",
                                          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                                          ,0x26d,"mp_sizeof_ext(0x00010001)");
                                      iVar5 = bcmp(str,buf + 7,0x10001);
                                      _ok((uint)(iVar5 == 0),"memcmp(s1, s2, 0x00010001) == 0",
                                          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                                          ,0x26d,"mp_encode_ext(x, 0x00010001) == x");
                                      _space((FILE *)_stdout);
                                      fwrite("# ",2,1,_stdout);
                                      fwrite("ext_safe",8,1,_stdout);
                                      fputc(10,_stdout);
                                      do {
                                        str[uVar7] = ((char)((uVar7 & 0xffffffff) / 0x1a) * -0x19 -
                                                     (char)((uVar7 & 0xffffffff) / 0x1a)) +
                                                     (char)uVar7 + 'a';
                                        uVar7 = uVar7 + 1;
                                      } while (uVar7 != 0xfe);
                                      local_50 = (byte *)CONCAT53(local_50._3_5_,0xfec7);
                                      _ok(1,"-sz == rl",
                                          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                                          ,0x26f,"size after mp_encode_ext_safe(NULL, &sz)");
                                      _ok(1,"d == NULL",
                                          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                                          ,0x26f,"mp_encode_ext_safe(NULL, &sz)");
                                      buf[1] = -0x39;
                                      buf[2] = -2;
                                      buf[3] = '\0';
                                      memcpy(buf + 4,str,0xfe);
                                      _ok(1,"sz == 0",
                                          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                                          ,0x26f,"size after mp_encode_ext_safe(buf, &sz)");
                                      _ok(1,"(d - data) == rl",
                                          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                                          ,0x26f,"len of mp_encode_ext_safe(buf, &sz)");
                                      _ok((uint)(buf[3] == local_50._2_1_ &&
                                                CONCAT11(buf[2],buf[1]) == (short)local_50),
                                          "memcmp(data, head, hl) == 0",
                                          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                                          ,0x26f,"head of mp_encode_ext_safe(buf, &sz)");
                                      iVar5 = bcmp(buf + 4,str,0xfe);
                                      _ok((uint)(iVar5 == 0),"memcmp(data + hl, str, (0xfe)) == 0",
                                          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                                          ,0x26f,"payload of mp_encode_ext_safe(buf, &sz)");
                                      _ok(1,"sz == -1",
                                          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                                          ,0x26f,"size after mp_encode_ext_safe(buf, &sz) overflow")
                                      ;
                                      _ok(1,"d == data",
                                          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                                          ,0x26f,"mp_encode_ext_safe(buf, &sz) overflow");
                                      buf[1] = -0x39;
                                      buf[2] = -2;
                                      buf[3] = '\0';
                                      memcpy(buf + 4,str,0xfe);
                                      _ok(1,"(d - data) == rl",
                                          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                                          ,0x26f,"len of mp_encode_ext_safe(buf, NULL)");
                                      _ok((uint)(buf[3] == local_50._2_1_ &&
                                                CONCAT11(buf[2],buf[1]) == (short)local_50),
                                          "memcmp(data, head, hl) == 0",
                                          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                                          ,0x26f,"head of mp_encode_ext_safe(buf, NULL)");
                                      iVar5 = bcmp(buf + 4,str,0xfe);
                                      _ok((uint)(iVar5 == 0),"memcmp(data + hl, str, (0xfe)) == 0",
                                          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                                          ,0x26f,"payload of mp_encode_ext_safe(buf, NULL)");
                                      _space((FILE *)_stdout);
                                      printf("# *** %s: done ***\n","test_exts");
                                      iVar5 = check_plan();
                                      return iVar5;
                                    }
                                  } while( true );
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
switchD_0012205d_caseD_ca:
  __assert_fail("0",
                "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/../msgpuck.h"
                ,0x867,"uint32_t mp_decode_extl(const char **, int8_t *)");
}

Assistant:

static int
test_exts(void)
{
	plan(25*9 + 11);
	header();

	test_ext(0x01);
	test_ext(0x02);
	test_ext(0x03);
	test_ext(0x04);
	test_ext(0x05);
	test_ext(0x06);
	test_ext(0x07);
	test_ext(0x08);
	test_ext(0x09);
	test_ext(0x0a);
	test_ext(0x0b);
	test_ext(0x0c);
	test_ext(0x0d);
	test_ext(0x0e);
	test_ext(0x0f);
	test_ext(0x10);

	test_ext(0x11);
	test_ext(0xfe);
	test_ext(0xff);

	test_ext(0x0100);
	test_ext(0x0101);
	test_ext(0xfffe);
	test_ext(0xffff);

	test_ext(0x00010000);
	test_ext(0x00010001);

	test_ext_safe(0xfe);

	footer();
	return check_plan();
}